

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<8,16>::
     occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  float *pfVar1;
  uint uVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  byte bVar52;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  ulong uVar56;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  long lVar57;
  byte bVar58;
  byte bVar59;
  ulong uVar60;
  byte bVar61;
  long lVar62;
  ulong uVar63;
  bool bVar64;
  undefined1 uVar65;
  undefined1 uVar66;
  ulong uVar67;
  uint uVar68;
  uint uVar132;
  uint uVar133;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  uint uVar135;
  uint uVar136;
  uint uVar137;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  uint uVar134;
  uint uVar138;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float pp;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar154;
  undefined4 uVar155;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar163 [32];
  undefined1 auVar156 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar174;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar175;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [32];
  undefined1 auVar224 [16];
  undefined1 auVar228 [32];
  undefined1 auVar226 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [16];
  undefined1 auVar234 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [16];
  undefined1 auVar240 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar241 [64];
  float fVar242;
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [28];
  float fVar249;
  float fVar250;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_cf4;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  float local_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [16];
  Primitive *local_928;
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar212 [32];
  
  uVar56 = (ulong)(byte)prim[1];
  lVar57 = uVar56 * 0x25;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar56 * 4 + 6);
  auVar99 = vpmovsxbd_avx2(auVar70);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar56 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar69);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar56 * 6 + 6);
  auVar102 = vpmovsxbd_avx2(auVar72);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar56 * 0xf + 6);
  auVar101 = vpmovsxbd_avx2(auVar73);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar100 = vpmovsxbd_avx2(auVar74);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar56 * 0x11 + 6);
  auVar97 = vpmovsxbd_avx2(auVar81);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar56 * 0x1a + 6);
  auVar98 = vpmovsxbd_avx2(auVar80);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar56 * 0x1b + 6);
  auVar91 = vpmovsxbd_avx2(auVar71);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar56 * 0x1c + 6);
  auVar92 = vpmovsxbd_avx2(auVar75);
  uVar155 = *(undefined4 *)(prim + lVar57 + 0x12);
  auVar76._4_4_ = uVar155;
  auVar76._0_4_ = uVar155;
  auVar76._8_4_ = uVar155;
  auVar76._12_4_ = uVar155;
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar69 = vsubps_avx512vl(auVar70,*(undefined1 (*) [16])(prim + lVar57 + 6));
  fVar16 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar57 + 0x16)) *
           *(float *)(prim + lVar57 + 0x1a);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 7 + 6));
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0xb + 6));
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 9 + 6));
  auVar83 = vpbroadcastd_avx512vl();
  auVar84 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar56 * 0xd + 6));
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0x12 + 6));
  auVar85 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar56 * 0x16 + 6));
  auVar70 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar70 = vinsertps_avx512f(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar69 = vmulps_avx512vl(auVar76,auVar69);
  auVar70 = vmulps_avx512vl(auVar76,auVar70);
  auVar86 = vcvtdq2ps_avx512vl(auVar99);
  auVar87 = vcvtdq2ps_avx512vl(auVar96);
  auVar88 = vcvtdq2ps_avx512vl(auVar102);
  auVar89 = vcvtdq2ps_avx512vl(auVar101);
  auVar90 = vcvtdq2ps_avx512vl(auVar100);
  auVar99 = vcvtdq2ps_avx(auVar97);
  auVar102 = vcvtdq2ps_avx(auVar98);
  auVar101 = vcvtdq2ps_avx(auVar91);
  auVar100 = vcvtdq2ps_avx(auVar92);
  uVar155 = auVar70._0_4_;
  auVar107._4_4_ = uVar155;
  auVar107._0_4_ = uVar155;
  auVar107._8_4_ = uVar155;
  auVar107._12_4_ = uVar155;
  auVar107._16_4_ = uVar155;
  auVar107._20_4_ = uVar155;
  auVar107._24_4_ = uVar155;
  auVar107._28_4_ = uVar155;
  auVar91 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar93 = vpermps_avx512vl(auVar91,ZEXT1632(auVar70));
  auVar94 = vpermps_avx512vl(auVar92,ZEXT1632(auVar70));
  auVar95 = vmulps_avx512vl(auVar94,auVar88);
  auVar97._4_4_ = auVar94._4_4_ * auVar99._4_4_;
  auVar97._0_4_ = auVar94._0_4_ * auVar99._0_4_;
  auVar97._8_4_ = auVar94._8_4_ * auVar99._8_4_;
  auVar97._12_4_ = auVar94._12_4_ * auVar99._12_4_;
  auVar97._16_4_ = auVar94._16_4_ * auVar99._16_4_;
  auVar97._20_4_ = auVar94._20_4_ * auVar99._20_4_;
  auVar97._24_4_ = auVar94._24_4_ * auVar99._24_4_;
  auVar97._28_4_ = auVar96._28_4_;
  auVar98._4_4_ = auVar100._4_4_ * auVar94._4_4_;
  auVar98._0_4_ = auVar100._0_4_ * auVar94._0_4_;
  auVar98._8_4_ = auVar100._8_4_ * auVar94._8_4_;
  auVar98._12_4_ = auVar100._12_4_ * auVar94._12_4_;
  auVar98._16_4_ = auVar100._16_4_ * auVar94._16_4_;
  auVar98._20_4_ = auVar100._20_4_ * auVar94._20_4_;
  auVar98._24_4_ = auVar100._24_4_ * auVar94._24_4_;
  auVar98._28_4_ = auVar94._28_4_;
  auVar96 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar87);
  auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar90);
  auVar70 = vfmadd231ps_fma(auVar98,auVar101,auVar93);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar107,auVar86);
  auVar97 = vfmadd231ps_avx512vl(auVar97,auVar107,auVar89);
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar102,auVar107);
  auVar98 = vbroadcastss_avx512vl(auVar69);
  auVar91 = vpermps_avx512vl(auVar91,ZEXT1632(auVar69));
  auVar92 = vpermps_avx512vl(auVar92,ZEXT1632(auVar69));
  auVar88 = vmulps_avx512vl(auVar92,auVar88);
  auVar99 = vmulps_avx512vl(auVar92,auVar99);
  auVar100 = vmulps_avx512vl(auVar92,auVar100);
  auVar92 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar87);
  auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,auVar90);
  auVar69 = vfmadd231ps_fma(auVar100,auVar91,auVar101);
  auVar101 = vfmadd231ps_avx512vl(auVar92,auVar98,auVar86);
  auVar100 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar89);
  auVar89._8_4_ = 0x7fffffff;
  auVar89._0_8_ = 0x7fffffff7fffffff;
  auVar89._12_4_ = 0x7fffffff;
  auVar89._16_4_ = 0x7fffffff;
  auVar89._20_4_ = 0x7fffffff;
  auVar89._24_4_ = 0x7fffffff;
  auVar89._28_4_ = 0x7fffffff;
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar98,auVar102);
  auVar99 = vandps_avx(auVar89,auVar96);
  auVar93._8_4_ = 0x219392ef;
  auVar93._0_8_ = 0x219392ef219392ef;
  auVar93._12_4_ = 0x219392ef;
  auVar93._16_4_ = 0x219392ef;
  auVar93._20_4_ = 0x219392ef;
  auVar93._24_4_ = 0x219392ef;
  auVar93._28_4_ = 0x219392ef;
  uVar63 = vcmpps_avx512vl(auVar99,auVar93,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar86._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar96._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar96._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar96._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar96._12_4_;
  bVar64 = (bool)((byte)(uVar63 >> 4) & 1);
  auVar86._16_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar96._16_4_;
  bVar64 = (bool)((byte)(uVar63 >> 5) & 1);
  auVar86._20_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar96._20_4_;
  bVar64 = (bool)((byte)(uVar63 >> 6) & 1);
  auVar86._24_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar96._24_4_;
  bVar64 = SUB81(uVar63 >> 7,0);
  auVar86._28_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar96._28_4_;
  auVar99 = vandps_avx(auVar89,auVar97);
  uVar63 = vcmpps_avx512vl(auVar99,auVar93,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar87._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar97._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar97._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar97._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar97._12_4_;
  bVar64 = (bool)((byte)(uVar63 >> 4) & 1);
  auVar87._16_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar97._16_4_;
  bVar64 = (bool)((byte)(uVar63 >> 5) & 1);
  auVar87._20_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar97._20_4_;
  bVar64 = (bool)((byte)(uVar63 >> 6) & 1);
  auVar87._24_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar97._24_4_;
  bVar64 = SUB81(uVar63 >> 7,0);
  auVar87._28_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar97._28_4_;
  auVar99 = vandps_avx(auVar89,ZEXT1632(auVar70));
  uVar63 = vcmpps_avx512vl(auVar99,auVar93,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar99._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar70._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar70._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar70._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar70._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar63 >> 7) * 0x219392ef;
  auVar102 = vrcp14ps_avx512vl(auVar86);
  auVar90._8_4_ = 0x3f800000;
  auVar90._0_8_ = 0x3f8000003f800000;
  auVar90._12_4_ = 0x3f800000;
  auVar90._16_4_ = 0x3f800000;
  auVar90._20_4_ = 0x3f800000;
  auVar90._24_4_ = 0x3f800000;
  auVar90._28_4_ = 0x3f800000;
  auVar70 = vfnmadd213ps_fma(auVar86,auVar102,auVar90);
  auVar70 = vfmadd132ps_fma(ZEXT1632(auVar70),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar87);
  auVar69 = vfnmadd213ps_fma(auVar87,auVar102,auVar90);
  auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar99);
  auVar72 = vfnmadd213ps_fma(auVar99,auVar102,auVar90);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar102,auVar102);
  auVar88._4_4_ = fVar16;
  auVar88._0_4_ = fVar16;
  auVar88._8_4_ = fVar16;
  auVar88._12_4_ = fVar16;
  auVar88._16_4_ = fVar16;
  auVar88._20_4_ = fVar16;
  auVar88._24_4_ = fVar16;
  auVar88._28_4_ = fVar16;
  auVar99 = vcvtdq2ps_avx(auVar103);
  auVar102 = vcvtdq2ps_avx(auVar104);
  auVar102 = vsubps_avx(auVar102,auVar99);
  auVar73 = vfmadd213ps_fma(auVar102,auVar88,auVar99);
  auVar99 = vcvtdq2ps_avx(auVar105);
  auVar102 = vcvtdq2ps_avx512vl(auVar84);
  auVar102 = vsubps_avx(auVar102,auVar99);
  auVar74 = vfmadd213ps_fma(auVar102,auVar88,auVar99);
  auVar99 = vcvtdq2ps_avx(auVar106);
  auVar102 = vcvtdq2ps_avx512vl(auVar85);
  auVar102 = vsubps_avx(auVar102,auVar99);
  auVar81 = vfmadd213ps_fma(auVar102,auVar88,auVar99);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0x14 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0x18 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar99);
  auVar80 = vfmadd213ps_fma(auVar102,auVar88,auVar99);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0x1d + 6));
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0x21 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar99);
  auVar71 = vfmadd213ps_fma(auVar102,auVar88,auVar99);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0x1f + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0x23 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar99);
  auVar75 = vfmadd213ps_fma(auVar102,auVar88,auVar99);
  auVar99 = vsubps_avx512vl(ZEXT1632(auVar73),auVar101);
  auVar91._4_4_ = auVar70._4_4_ * auVar99._4_4_;
  auVar91._0_4_ = auVar70._0_4_ * auVar99._0_4_;
  auVar91._8_4_ = auVar70._8_4_ * auVar99._8_4_;
  auVar91._12_4_ = auVar70._12_4_ * auVar99._12_4_;
  auVar91._16_4_ = auVar99._16_4_ * 0.0;
  auVar91._20_4_ = auVar99._20_4_ * 0.0;
  auVar91._24_4_ = auVar99._24_4_ * 0.0;
  auVar91._28_4_ = auVar99._28_4_;
  auVar99 = vsubps_avx512vl(ZEXT1632(auVar74),auVar101);
  auVar106._0_4_ = auVar70._0_4_ * auVar99._0_4_;
  auVar106._4_4_ = auVar70._4_4_ * auVar99._4_4_;
  auVar106._8_4_ = auVar70._8_4_ * auVar99._8_4_;
  auVar106._12_4_ = auVar70._12_4_ * auVar99._12_4_;
  auVar106._16_4_ = auVar99._16_4_ * 0.0;
  auVar106._20_4_ = auVar99._20_4_ * 0.0;
  auVar106._24_4_ = auVar99._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar99 = vsubps_avx(ZEXT1632(auVar81),auVar100);
  auVar92._4_4_ = auVar69._4_4_ * auVar99._4_4_;
  auVar92._0_4_ = auVar69._0_4_ * auVar99._0_4_;
  auVar92._8_4_ = auVar69._8_4_ * auVar99._8_4_;
  auVar92._12_4_ = auVar69._12_4_ * auVar99._12_4_;
  auVar92._16_4_ = auVar99._16_4_ * 0.0;
  auVar92._20_4_ = auVar99._20_4_ * 0.0;
  auVar92._24_4_ = auVar99._24_4_ * 0.0;
  auVar92._28_4_ = auVar99._28_4_;
  auVar99 = vsubps_avx(ZEXT1632(auVar80),auVar100);
  auVar105._0_4_ = auVar69._0_4_ * auVar99._0_4_;
  auVar105._4_4_ = auVar69._4_4_ * auVar99._4_4_;
  auVar105._8_4_ = auVar69._8_4_ * auVar99._8_4_;
  auVar105._12_4_ = auVar69._12_4_ * auVar99._12_4_;
  auVar105._16_4_ = auVar99._16_4_ * 0.0;
  auVar105._20_4_ = auVar99._20_4_ * 0.0;
  auVar105._24_4_ = auVar99._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar99 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar76));
  auVar103._4_4_ = auVar72._4_4_ * auVar99._4_4_;
  auVar103._0_4_ = auVar72._0_4_ * auVar99._0_4_;
  auVar103._8_4_ = auVar72._8_4_ * auVar99._8_4_;
  auVar103._12_4_ = auVar72._12_4_ * auVar99._12_4_;
  auVar103._16_4_ = auVar99._16_4_ * 0.0;
  auVar103._20_4_ = auVar99._20_4_ * 0.0;
  auVar103._24_4_ = auVar99._24_4_ * 0.0;
  auVar103._28_4_ = auVar99._28_4_;
  auVar99 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar76));
  auVar104._0_4_ = auVar72._0_4_ * auVar99._0_4_;
  auVar104._4_4_ = auVar72._4_4_ * auVar99._4_4_;
  auVar104._8_4_ = auVar72._8_4_ * auVar99._8_4_;
  auVar104._12_4_ = auVar72._12_4_ * auVar99._12_4_;
  auVar104._16_4_ = auVar99._16_4_ * 0.0;
  auVar104._20_4_ = auVar99._20_4_ * 0.0;
  auVar104._24_4_ = auVar99._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar99 = vpminsd_avx2(auVar91,auVar106);
  auVar102 = vpminsd_avx2(auVar92,auVar105);
  auVar99 = vmaxps_avx(auVar99,auVar102);
  auVar102 = vpminsd_avx2(auVar103,auVar104);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar101._4_4_ = uVar155;
  auVar101._0_4_ = uVar155;
  auVar101._8_4_ = uVar155;
  auVar101._12_4_ = uVar155;
  auVar101._16_4_ = uVar155;
  auVar101._20_4_ = uVar155;
  auVar101._24_4_ = uVar155;
  auVar101._28_4_ = uVar155;
  auVar102 = vmaxps_avx512vl(auVar102,auVar101);
  auVar99 = vmaxps_avx(auVar99,auVar102);
  auVar102._8_4_ = 0x3f7ffffa;
  auVar102._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar102._12_4_ = 0x3f7ffffa;
  auVar102._16_4_ = 0x3f7ffffa;
  auVar102._20_4_ = 0x3f7ffffa;
  auVar102._24_4_ = 0x3f7ffffa;
  auVar102._28_4_ = 0x3f7ffffa;
  local_5c0 = vmulps_avx512vl(auVar99,auVar102);
  auVar99 = vpmaxsd_avx2(auVar91,auVar106);
  auVar102 = vpmaxsd_avx2(auVar92,auVar105);
  auVar99 = vminps_avx(auVar99,auVar102);
  auVar102 = vpmaxsd_avx2(auVar103,auVar104);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar100._4_4_ = uVar155;
  auVar100._0_4_ = uVar155;
  auVar100._8_4_ = uVar155;
  auVar100._12_4_ = uVar155;
  auVar100._16_4_ = uVar155;
  auVar100._20_4_ = uVar155;
  auVar100._24_4_ = uVar155;
  auVar100._28_4_ = uVar155;
  auVar102 = vminps_avx512vl(auVar102,auVar100);
  auVar99 = vminps_avx(auVar99,auVar102);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar96._16_4_ = 0x3f800003;
  auVar96._20_4_ = 0x3f800003;
  auVar96._24_4_ = 0x3f800003;
  auVar96._28_4_ = 0x3f800003;
  auVar99 = vmulps_avx512vl(auVar99,auVar96);
  uVar18 = vcmpps_avx512vl(local_5c0,auVar99,2);
  uVar20 = vpcmpgtd_avx512vl(auVar83,_DAT_01fb4ba0);
  uVar63 = (ulong)(byte)((byte)uVar18 & (byte)uVar20);
  auVar153 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar153);
  local_928 = prim;
LAB_01b6d0e8:
  if (uVar63 == 0) {
LAB_01b6fa15:
    return uVar63 != 0;
  }
  lVar57 = 0;
  for (uVar56 = uVar63; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    lVar57 = lVar57 + 1;
  }
  uVar2 = *(uint *)(local_928 + 2);
  pGVar3 = (context->scene->geometries).items[uVar2].ptr;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(local_928 + lVar57 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar16 = (pGVar3->time_range).lower;
  fVar16 = pGVar3->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x1c0) - fVar16) / ((pGVar3->time_range).upper - fVar16));
  auVar70 = vroundss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16),9);
  auVar70 = vminss_avx(auVar70,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar70 = vmaxss_avx(ZEXT816(0) << 0x20,auVar70);
  fVar16 = fVar16 - auVar70._0_4_;
  fVar242 = 1.0 - fVar16;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar62 = (long)(int)auVar70._0_4_ * 0x38;
  lVar5 = *(long *)(_Var4 + 0x10 + lVar62);
  lVar6 = *(long *)(_Var4 + 0x38 + lVar62);
  lVar7 = *(long *)(_Var4 + 0x48 + lVar62);
  pfVar1 = (float *)(lVar6 + lVar7 * uVar56);
  auVar139._0_4_ = fVar16 * *pfVar1;
  auVar139._4_4_ = fVar16 * pfVar1[1];
  auVar139._8_4_ = fVar16 * pfVar1[2];
  auVar139._12_4_ = fVar16 * pfVar1[3];
  lVar57 = uVar56 + 1;
  pfVar1 = (float *)(lVar6 + lVar7 * lVar57);
  auVar82._0_4_ = fVar16 * *pfVar1;
  auVar82._4_4_ = fVar16 * pfVar1[1];
  auVar82._8_4_ = fVar16 * pfVar1[2];
  auVar82._12_4_ = fVar16 * pfVar1[3];
  p_Var8 = pGVar3[4].occlusionFilterN;
  auVar214._4_4_ = fVar242;
  auVar214._0_4_ = fVar242;
  auVar214._8_4_ = fVar242;
  auVar214._12_4_ = fVar242;
  auVar73 = vfmadd231ps_fma(auVar139,auVar214,
                            *(undefined1 (*) [16])(*(long *)(_Var4 + lVar62) + lVar5 * uVar56));
  auVar74 = vfmadd231ps_fma(auVar82,auVar214,
                            *(undefined1 (*) [16])(*(long *)(_Var4 + lVar62) + lVar5 * lVar57));
  pfVar1 = (float *)(*(long *)(p_Var8 + lVar62 + 0x38) + uVar56 * *(long *)(p_Var8 + lVar62 + 0x48))
  ;
  auVar78._0_4_ = fVar16 * *pfVar1;
  auVar78._4_4_ = fVar16 * pfVar1[1];
  auVar78._8_4_ = fVar16 * pfVar1[2];
  auVar78._12_4_ = fVar16 * pfVar1[3];
  pfVar1 = (float *)(*(long *)(p_Var8 + lVar62 + 0x38) + *(long *)(p_Var8 + lVar62 + 0x48) * lVar57)
  ;
  auVar79._0_4_ = fVar16 * *pfVar1;
  auVar79._4_4_ = fVar16 * pfVar1[1];
  auVar79._8_4_ = fVar16 * pfVar1[2];
  auVar79._12_4_ = fVar16 * pfVar1[3];
  auVar72 = vfmadd231ps_fma(auVar78,auVar214,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var8 + lVar62) +
                             *(long *)(p_Var8 + lVar62 + 0x10) * uVar56));
  auVar81 = vfmadd231ps_fma(auVar79,auVar214,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var8 + lVar62) +
                             *(long *)(p_Var8 + lVar62 + 0x10) * lVar57));
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar69 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_7a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_7c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar70 = vunpcklps_avx512vl(local_7a0._0_16_,local_7c0._0_16_);
  _local_7e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar75 = local_7e0._0_16_;
  local_9d0 = vinsertps_avx512f(auVar70,auVar75,0x28);
  auVar221._8_4_ = 0xbeaaaaab;
  auVar221._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar221._12_4_ = 0xbeaaaaab;
  auVar80 = vfnmadd213ps_fma(auVar72,auVar221,auVar73);
  auVar72 = vfmadd213ps_fma(auVar81,auVar221,auVar74);
  auVar222._0_4_ = auVar74._0_4_ + auVar73._0_4_ + auVar80._0_4_ + auVar72._0_4_;
  auVar222._4_4_ = auVar74._4_4_ + auVar73._4_4_ + auVar80._4_4_ + auVar72._4_4_;
  auVar222._8_4_ = auVar74._8_4_ + auVar73._8_4_ + auVar80._8_4_ + auVar72._8_4_;
  auVar222._12_4_ = auVar74._12_4_ + auVar73._12_4_ + auVar80._12_4_ + auVar72._12_4_;
  auVar77._8_4_ = 0x3e800000;
  auVar77._0_8_ = 0x3e8000003e800000;
  auVar77._12_4_ = 0x3e800000;
  auVar70 = vmulps_avx512vl(auVar222,auVar77);
  auVar70 = vsubps_avx(auVar70,auVar69);
  auVar70 = vdpps_avx(auVar70,local_9d0,0x7f);
  auVar153 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar153);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  fVar16 = *(float *)(ray + k * 4 + 0xc0);
  auVar231._4_12_ = ZEXT812(0) << 0x20;
  auVar231._0_4_ = local_9e0._0_4_;
  auVar71 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar231);
  auVar81 = vfnmadd213ss_fma(auVar71,local_9e0,ZEXT416(0x40000000));
  local_5a0 = auVar70._0_4_ * auVar71._0_4_ * auVar81._0_4_;
  auVar230 = ZEXT3264(_DAT_01f7b040);
  auVar237._4_4_ = local_5a0;
  auVar237._0_4_ = local_5a0;
  auVar237._8_4_ = local_5a0;
  auVar237._12_4_ = local_5a0;
  fStack_750 = local_5a0;
  _local_760 = auVar237;
  fStack_74c = local_5a0;
  fStack_748 = local_5a0;
  fStack_744 = local_5a0;
  auVar70 = vfmadd231ps_fma(auVar69,local_9d0,auVar237);
  auVar70 = vblendps_avx(auVar70,ZEXT816(0) << 0x40,8);
  auVar69 = vsubps_avx(auVar73,auVar70);
  auVar72 = vsubps_avx(auVar72,auVar70);
  auVar73 = vsubps_avx(auVar80,auVar70);
  auVar70 = vsubps_avx(auVar74,auVar70);
  uVar155 = auVar69._0_4_;
  local_a00._4_4_ = uVar155;
  local_a00._0_4_ = uVar155;
  local_a00._8_4_ = uVar155;
  local_a00._12_4_ = uVar155;
  local_a00._16_4_ = uVar155;
  local_a00._20_4_ = uVar155;
  local_a00._24_4_ = uVar155;
  local_a00._28_4_ = uVar155;
  auVar245 = ZEXT3264(local_a00);
  auVar84._8_4_ = 1;
  auVar84._0_8_ = 0x100000001;
  auVar84._12_4_ = 1;
  auVar84._16_4_ = 1;
  auVar84._20_4_ = 1;
  auVar84._24_4_ = 1;
  auVar84._28_4_ = 1;
  local_8a0 = ZEXT1632(auVar69);
  local_a20 = vpermps_avx512vl(auVar84,local_8a0);
  auVar256 = ZEXT3264(local_a20);
  auVar85._8_4_ = 2;
  auVar85._0_8_ = 0x200000002;
  auVar85._12_4_ = 2;
  auVar85._16_4_ = 2;
  auVar85._20_4_ = 2;
  auVar85._24_4_ = 2;
  auVar85._28_4_ = 2;
  local_a40 = vpermps_avx2(auVar85,local_8a0);
  auVar252 = ZEXT3264(local_a40);
  auVar94._8_4_ = 3;
  auVar94._0_8_ = 0x300000003;
  auVar94._12_4_ = 3;
  auVar94._16_4_ = 3;
  auVar94._20_4_ = 3;
  auVar94._24_4_ = 3;
  auVar94._28_4_ = 3;
  local_a60 = vpermps_avx2(auVar94,local_8a0);
  auVar241 = ZEXT3264(local_a60);
  fVar242 = auVar73._0_4_;
  auVar95._4_4_ = fVar242;
  auVar95._0_4_ = fVar242;
  auVar95._8_4_ = fVar242;
  auVar95._12_4_ = fVar242;
  auVar95._16_4_ = fVar242;
  auVar95._20_4_ = fVar242;
  auVar95._24_4_ = fVar242;
  auVar95._28_4_ = fVar242;
  local_8e0 = ZEXT1632(auVar73);
  local_a80 = vpermps_avx2(auVar84,local_8e0);
  auVar254 = ZEXT3264(local_a80);
  local_aa0 = vpermps_avx512vl(auVar85,local_8e0);
  local_ac0 = vpermps_avx2(auVar94,local_8e0);
  auVar244 = ZEXT3264(local_ac0);
  auVar99 = vbroadcastss_avx512vl(auVar72);
  auVar255 = ZEXT3264(auVar99);
  local_8c0 = ZEXT1632(auVar72);
  auVar102 = vpermps_avx512vl(auVar84,local_8c0);
  auVar101 = vpermps_avx512vl(auVar85,local_8c0);
  auVar100 = vpermps_avx512vl(auVar94,local_8c0);
  auVar96 = vbroadcastss_avx512vl(auVar70);
  _local_900 = ZEXT1632(auVar70);
  auVar97 = vpermps_avx512vl(auVar84,_local_900);
  auVar98 = vpermps_avx512vl(auVar85,_local_900);
  auVar91 = vpermps_avx512vl(auVar94,_local_900);
  auVar70 = vmulss_avx512f(auVar75,auVar75);
  auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar70),local_7c0,local_7c0);
  local_580 = vfmadd231ps_avx512vl(auVar92,local_7a0,local_7a0);
  local_560._0_4_ = local_580._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar83._8_4_ = 0x7fffffff;
  auVar83._0_8_ = 0x7fffffff7fffffff;
  auVar83._12_4_ = 0x7fffffff;
  auVar83._16_4_ = 0x7fffffff;
  auVar83._20_4_ = 0x7fffffff;
  auVar83._24_4_ = 0x7fffffff;
  auVar83._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar83);
  local_970 = ZEXT416((uint)local_5a0);
  local_5a0 = fVar16 - local_5a0;
  auVar236 = ZEXT3264(local_aa0);
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  uVar56 = 0;
  bVar55 = 0;
  local_cf4 = 1;
  auVar153 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar153);
  auVar70 = vsqrtss_avx(local_9e0,local_9e0);
  auVar69 = vsqrtss_avx(local_9e0,local_9e0);
  auVar153 = ZEXT3264(local_a80);
  local_650 = ZEXT816(0x3f80000000000000);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar258 = ZEXT3264(auVar92);
  do {
    auVar72 = vmovshdup_avx(local_650);
    auVar72 = vsubps_avx(auVar72,local_650);
    fVar170 = auVar72._0_4_;
    fVar171 = fVar170 * 0.04761905;
    auVar195._0_4_ = local_650._0_4_;
    auVar195._4_4_ = auVar195._0_4_;
    auVar195._8_4_ = auVar195._0_4_;
    auVar195._12_4_ = auVar195._0_4_;
    auVar195._16_4_ = auVar195._0_4_;
    auVar195._20_4_ = auVar195._0_4_;
    auVar195._24_4_ = auVar195._0_4_;
    auVar195._28_4_ = auVar195._0_4_;
    auVar199._4_4_ = fVar170;
    auVar199._0_4_ = fVar170;
    auVar199._8_4_ = fVar170;
    auVar199._12_4_ = fVar170;
    auVar212._16_4_ = fVar170;
    auVar212._0_16_ = auVar199;
    auVar212._20_4_ = fVar170;
    auVar212._24_4_ = fVar170;
    auVar212._28_4_ = fVar170;
    auVar72 = vfmadd231ps_fma(auVar195,auVar212,auVar230._0_32_);
    auVar257 = auVar258._0_32_;
    auVar92 = vsubps_avx512vl(auVar257,ZEXT1632(auVar72));
    fVar154 = auVar72._0_4_;
    fVar167 = auVar72._4_4_;
    auVar113._4_4_ = fVar242 * fVar167;
    auVar113._0_4_ = fVar242 * fVar154;
    fVar168 = auVar72._8_4_;
    auVar113._8_4_ = fVar242 * fVar168;
    fVar169 = auVar72._12_4_;
    auVar113._12_4_ = fVar242 * fVar169;
    auVar113._16_4_ = fVar242 * 0.0;
    auVar113._20_4_ = fVar242 * 0.0;
    auVar113._24_4_ = fVar242 * 0.0;
    auVar113._28_4_ = auVar195._0_4_;
    auVar114._4_4_ = auVar153._4_4_ * fVar167;
    auVar114._0_4_ = auVar153._0_4_ * fVar154;
    auVar114._8_4_ = auVar153._8_4_ * fVar168;
    auVar114._12_4_ = auVar153._12_4_ * fVar169;
    auVar114._16_4_ = auVar153._16_4_ * 0.0;
    auVar114._20_4_ = auVar153._20_4_ * 0.0;
    auVar114._24_4_ = auVar153._24_4_ * 0.0;
    auVar114._28_4_ = fVar170;
    auVar51._4_4_ = auVar236._4_4_ * fVar167;
    auVar51._0_4_ = auVar236._0_4_ * fVar154;
    auVar51._8_4_ = auVar236._8_4_ * fVar168;
    auVar51._12_4_ = auVar236._12_4_ * fVar169;
    auVar51._16_4_ = auVar236._16_4_ * 0.0;
    auVar51._20_4_ = auVar236._20_4_ * 0.0;
    auVar51._24_4_ = auVar236._24_4_ * 0.0;
    auVar51._28_4_ = fVar242;
    auVar230._0_4_ = auVar244._0_4_ * fVar154;
    auVar230._4_4_ = auVar244._4_4_ * fVar167;
    auVar230._8_4_ = auVar244._8_4_ * fVar168;
    auVar230._12_4_ = auVar244._12_4_ * fVar169;
    auVar230._16_4_ = auVar244._16_4_ * 0.0;
    auVar230._20_4_ = auVar244._20_4_ * 0.0;
    auVar230._28_36_ = auVar236._28_36_;
    auVar230._24_4_ = auVar244._24_4_ * 0.0;
    auVar73 = vfmadd231ps_fma(auVar113,auVar92,auVar245._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar114,auVar92,auVar256._0_32_);
    auVar74 = vfmadd231ps_fma(auVar51,auVar92,auVar252._0_32_);
    auVar81 = vfmadd231ps_fma(auVar230._0_32_,auVar92,auVar241._0_32_);
    auVar104 = vmulps_avx512vl(auVar255._0_32_,ZEXT1632(auVar72));
    auVar84 = ZEXT1632(auVar72);
    auVar105 = vmulps_avx512vl(auVar102,auVar84);
    auVar106 = vmulps_avx512vl(auVar101,auVar84);
    auVar83 = vmulps_avx512vl(auVar100,auVar84);
    auVar80 = vfmadd231ps_fma(auVar104,auVar92,auVar95);
    auVar71 = vfmadd231ps_fma(auVar105,auVar92,auVar153._0_32_);
    auVar75 = vfmadd231ps_fma(auVar106,auVar92,auVar236._0_32_);
    auVar76 = vfmadd231ps_fma(auVar83,auVar92,auVar244._0_32_);
    auVar104 = vmulps_avx512vl(auVar96,auVar84);
    auVar105 = vmulps_avx512vl(auVar97,auVar84);
    auVar106 = vmulps_avx512vl(auVar98,auVar84);
    auVar83 = vmulps_avx512vl(auVar91,auVar84);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar92,auVar255._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar92,auVar102);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar92,auVar101);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar92,auVar100);
    auVar153._28_36_ = auVar254._28_36_;
    auVar153._0_28_ =
         ZEXT1628(CONCAT412(fVar169 * auVar80._12_4_,
                            CONCAT48(fVar168 * auVar80._8_4_,
                                     CONCAT44(fVar167 * auVar80._4_4_,fVar154 * auVar80._0_4_))));
    auVar84 = vmulps_avx512vl(auVar84,ZEXT1632(auVar71));
    auVar85 = vmulps_avx512vl(ZEXT1632(auVar72),ZEXT1632(auVar75));
    auVar86 = vmulps_avx512vl(ZEXT1632(auVar72),ZEXT1632(auVar76));
    auVar72 = vfmadd231ps_fma(auVar153._0_32_,auVar92,ZEXT1632(auVar73));
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar92,auVar103);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar92,ZEXT1632(auVar74));
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar92,ZEXT1632(auVar81));
    auVar234._0_4_ = auVar104._0_4_ * fVar154;
    auVar234._4_4_ = auVar104._4_4_ * fVar167;
    auVar234._8_4_ = auVar104._8_4_ * fVar168;
    auVar234._12_4_ = auVar104._12_4_ * fVar169;
    auVar234._16_4_ = auVar104._16_4_ * 0.0;
    auVar234._20_4_ = auVar104._20_4_ * 0.0;
    auVar234._24_4_ = auVar104._24_4_ * 0.0;
    auVar234._28_4_ = 0;
    auVar115._4_4_ = auVar105._4_4_ * fVar167;
    auVar115._0_4_ = auVar105._0_4_ * fVar154;
    auVar115._8_4_ = auVar105._8_4_ * fVar168;
    auVar115._12_4_ = auVar105._12_4_ * fVar169;
    auVar115._16_4_ = auVar105._16_4_ * 0.0;
    auVar115._20_4_ = auVar105._20_4_ * 0.0;
    auVar115._24_4_ = auVar105._24_4_ * 0.0;
    auVar115._28_4_ = auVar104._28_4_;
    auVar219._4_4_ = auVar106._4_4_ * fVar167;
    auVar219._0_4_ = auVar106._0_4_ * fVar154;
    auVar219._8_4_ = auVar106._8_4_ * fVar168;
    auVar219._12_4_ = auVar106._12_4_ * fVar169;
    auVar219._16_4_ = auVar106._16_4_ * 0.0;
    auVar219._20_4_ = auVar106._20_4_ * 0.0;
    auVar219._24_4_ = auVar106._24_4_ * 0.0;
    auVar219._28_4_ = auVar105._28_4_;
    auVar116._4_4_ = auVar83._4_4_ * fVar167;
    auVar116._0_4_ = auVar83._0_4_ * fVar154;
    auVar116._8_4_ = auVar83._8_4_ * fVar168;
    auVar116._12_4_ = auVar83._12_4_ * fVar169;
    auVar116._16_4_ = auVar83._16_4_ * 0.0;
    auVar116._20_4_ = auVar83._20_4_ * 0.0;
    auVar116._24_4_ = auVar83._24_4_ * 0.0;
    auVar116._28_4_ = auVar106._28_4_;
    auVar73 = vfmadd231ps_fma(auVar234,auVar92,ZEXT1632(auVar80));
    auVar74 = vfmadd231ps_fma(auVar115,auVar92,ZEXT1632(auVar71));
    auVar81 = vfmadd231ps_fma(auVar219,auVar92,ZEXT1632(auVar75));
    auVar80 = vfmadd231ps_fma(auVar116,auVar92,ZEXT1632(auVar76));
    auVar117._28_4_ = auVar103._28_4_;
    auVar117._0_28_ =
         ZEXT1628(CONCAT412(auVar74._12_4_ * fVar169,
                            CONCAT48(auVar74._8_4_ * fVar168,
                                     CONCAT44(auVar74._4_4_ * fVar167,auVar74._0_4_ * fVar154))));
    auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar169 * auVar73._12_4_,
                                                 CONCAT48(fVar168 * auVar73._8_4_,
                                                          CONCAT44(fVar167 * auVar73._4_4_,
                                                                   fVar154 * auVar73._0_4_)))),
                              auVar92,ZEXT1632(auVar72));
    auVar87 = vfmadd231ps_avx512vl(auVar117,auVar92,auVar84);
    auVar88 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar81._12_4_ * fVar169,
                                            CONCAT48(auVar81._8_4_ * fVar168,
                                                     CONCAT44(auVar81._4_4_ * fVar167,
                                                              auVar81._0_4_ * fVar154)))),auVar92,
                         auVar85);
    auVar103 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar80._12_4_ * fVar169,
                                             CONCAT48(auVar80._8_4_ * fVar168,
                                                      CONCAT44(auVar80._4_4_ * fVar167,
                                                               auVar80._0_4_ * fVar154)))),auVar86,
                          auVar92);
    auVar92 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar72));
    auVar104 = vsubps_avx512vl(ZEXT1632(auVar74),auVar84);
    auVar105 = vsubps_avx512vl(ZEXT1632(auVar81),auVar85);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar80),auVar86);
    auVar247._0_4_ = fVar171 * auVar92._0_4_ * 3.0;
    auVar247._4_4_ = fVar171 * auVar92._4_4_ * 3.0;
    auVar247._8_4_ = fVar171 * auVar92._8_4_ * 3.0;
    auVar247._12_4_ = fVar171 * auVar92._12_4_ * 3.0;
    auVar247._16_4_ = fVar171 * auVar92._16_4_ * 3.0;
    auVar247._20_4_ = fVar171 * auVar92._20_4_ * 3.0;
    auVar247._24_4_ = fVar171 * auVar92._24_4_ * 3.0;
    auVar247._28_4_ = 0;
    auVar251._0_4_ = fVar171 * auVar104._0_4_ * 3.0;
    auVar251._4_4_ = fVar171 * auVar104._4_4_ * 3.0;
    auVar251._8_4_ = fVar171 * auVar104._8_4_ * 3.0;
    auVar251._12_4_ = fVar171 * auVar104._12_4_ * 3.0;
    auVar251._16_4_ = fVar171 * auVar104._16_4_ * 3.0;
    auVar251._20_4_ = fVar171 * auVar104._20_4_ * 3.0;
    auVar251._24_4_ = fVar171 * auVar104._24_4_ * 3.0;
    auVar251._28_4_ = 0;
    auVar121._4_4_ = fVar171 * auVar105._4_4_ * 3.0;
    auVar121._0_4_ = fVar171 * auVar105._0_4_ * 3.0;
    auVar121._8_4_ = fVar171 * auVar105._8_4_ * 3.0;
    auVar121._12_4_ = fVar171 * auVar105._12_4_ * 3.0;
    auVar121._16_4_ = fVar171 * auVar105._16_4_ * 3.0;
    auVar121._20_4_ = fVar171 * auVar105._20_4_ * 3.0;
    auVar121._24_4_ = fVar171 * auVar105._24_4_ * 3.0;
    auVar121._28_4_ = auVar83._28_4_;
    fVar154 = auVar106._0_4_ * 3.0 * fVar171;
    fVar167 = auVar106._4_4_ * 3.0 * fVar171;
    auVar118._4_4_ = fVar167;
    auVar118._0_4_ = fVar154;
    fVar168 = auVar106._8_4_ * 3.0 * fVar171;
    auVar118._8_4_ = fVar168;
    fVar169 = auVar106._12_4_ * 3.0 * fVar171;
    auVar118._12_4_ = fVar169;
    fVar170 = auVar106._16_4_ * 3.0 * fVar171;
    auVar118._16_4_ = fVar170;
    fVar172 = auVar106._20_4_ * 3.0 * fVar171;
    auVar118._20_4_ = fVar172;
    fVar173 = auVar106._24_4_ * 3.0 * fVar171;
    auVar118._24_4_ = fVar173;
    auVar118._28_4_ = fVar171;
    auVar72 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar72);
    auVar83 = vpermt2ps_avx512vl(ZEXT1632(auVar71),_DAT_01fb9fc0,ZEXT1632(auVar72));
    auVar84 = vpermt2ps_avx512vl(auVar87,_DAT_01fb9fc0,ZEXT1632(auVar72));
    auVar104 = ZEXT1632(auVar72);
    auVar85 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,auVar104);
    auVar227._0_4_ = auVar103._0_4_ + fVar154;
    auVar227._4_4_ = auVar103._4_4_ + fVar167;
    auVar227._8_4_ = auVar103._8_4_ + fVar168;
    auVar227._12_4_ = auVar103._12_4_ + fVar169;
    auVar227._16_4_ = auVar103._16_4_ + fVar170;
    auVar227._20_4_ = auVar103._20_4_ + fVar172;
    auVar227._24_4_ = auVar103._24_4_ + fVar173;
    auVar227._28_4_ = auVar103._28_4_ + fVar171;
    auVar92 = vmaxps_avx(auVar103,auVar227);
    auVar86 = vminps_avx512vl(auVar103,auVar227);
    auVar89 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,auVar104);
    auVar90 = vpermt2ps_avx512vl(auVar247,_DAT_01fb9fc0,auVar104);
    auVar93 = vpermt2ps_avx512vl(auVar251,_DAT_01fb9fc0,auVar104);
    auVar116 = ZEXT1632(auVar72);
    auVar94 = vpermt2ps_avx512vl(auVar121,_DAT_01fb9fc0,auVar116);
    auVar103 = vpermt2ps_avx512vl(auVar118,_DAT_01fb9fc0,auVar116);
    auVar103 = vsubps_avx(auVar89,auVar103);
    auVar104 = vsubps_avx(auVar83,ZEXT1632(auVar71));
    auVar105 = vsubps_avx(auVar84,auVar87);
    auVar106 = vsubps_avx(auVar85,auVar88);
    auVar107 = vmulps_avx512vl(auVar105,auVar121);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar251,auVar106);
    auVar108 = vmulps_avx512vl(auVar106,auVar247);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar121,auVar104);
    auVar109 = vmulps_avx512vl(auVar104,auVar251);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar247,auVar105);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar108 = vmulps_avx512vl(auVar106,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar105);
    auVar110 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar104);
    auVar108 = vrcp14ps_avx512vl(auVar110);
    auVar109 = vfnmadd213ps_avx512vl(auVar108,auVar110,auVar257);
    auVar108 = vfmadd132ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vmulps_avx512vl(auVar107,auVar108);
    auVar109 = vmulps_avx512vl(auVar105,auVar94);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar93,auVar106);
    auVar111 = vmulps_avx512vl(auVar106,auVar90);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar94,auVar104);
    auVar112 = vmulps_avx512vl(auVar104,auVar93);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar90,auVar105);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar109 = vfmadd231ps_avx512vl(auVar111,auVar109,auVar109);
    auVar108 = vmulps_avx512vl(auVar109,auVar108);
    auVar107 = vmaxps_avx512vl(auVar107,auVar108);
    auVar107 = vsqrtps_avx512vl(auVar107);
    auVar108 = vmaxps_avx512vl(auVar103,auVar89);
    auVar92 = vmaxps_avx512vl(auVar92,auVar108);
    auVar112 = vaddps_avx512vl(auVar107,auVar92);
    auVar92 = vminps_avx(auVar103,auVar89);
    auVar92 = vminps_avx512vl(auVar86,auVar92);
    auVar92 = vsubps_avx512vl(auVar92,auVar107);
    auVar108._8_4_ = 0x3f800002;
    auVar108._0_8_ = 0x3f8000023f800002;
    auVar108._12_4_ = 0x3f800002;
    auVar108._16_4_ = 0x3f800002;
    auVar108._20_4_ = 0x3f800002;
    auVar108._24_4_ = 0x3f800002;
    auVar108._28_4_ = 0x3f800002;
    auVar103 = vmulps_avx512vl(auVar112,auVar108);
    auVar109._8_4_ = 0x3f7ffffc;
    auVar109._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar109._12_4_ = 0x3f7ffffc;
    auVar109._16_4_ = 0x3f7ffffc;
    auVar109._20_4_ = 0x3f7ffffc;
    auVar109._24_4_ = 0x3f7ffffc;
    auVar109._28_4_ = 0x3f7ffffc;
    auVar92 = vmulps_avx512vl(auVar92,auVar109);
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    auVar86 = vrsqrt14ps_avx512vl(auVar110);
    auVar111._8_4_ = 0xbf000000;
    auVar111._0_8_ = 0xbf000000bf000000;
    auVar111._12_4_ = 0xbf000000;
    auVar111._16_4_ = 0xbf000000;
    auVar111._20_4_ = 0xbf000000;
    auVar111._24_4_ = 0xbf000000;
    auVar111._28_4_ = 0xbf000000;
    auVar89 = vmulps_avx512vl(auVar110,auVar111);
    fVar154 = auVar86._0_4_;
    fVar167 = auVar86._4_4_;
    fVar168 = auVar86._8_4_;
    fVar169 = auVar86._12_4_;
    fVar171 = auVar86._16_4_;
    fVar170 = auVar86._20_4_;
    fVar172 = auVar86._24_4_;
    auVar122._4_4_ = fVar167 * fVar167 * fVar167 * auVar89._4_4_;
    auVar122._0_4_ = fVar154 * fVar154 * fVar154 * auVar89._0_4_;
    auVar122._8_4_ = fVar168 * fVar168 * fVar168 * auVar89._8_4_;
    auVar122._12_4_ = fVar169 * fVar169 * fVar169 * auVar89._12_4_;
    auVar122._16_4_ = fVar171 * fVar171 * fVar171 * auVar89._16_4_;
    auVar122._20_4_ = fVar170 * fVar170 * fVar170 * auVar89._20_4_;
    auVar122._24_4_ = fVar172 * fVar172 * fVar172 * auVar89._24_4_;
    auVar122._28_4_ = auVar112._28_4_;
    auVar110._8_4_ = 0x3fc00000;
    auVar110._0_8_ = 0x3fc000003fc00000;
    auVar110._12_4_ = 0x3fc00000;
    auVar110._16_4_ = 0x3fc00000;
    auVar110._20_4_ = 0x3fc00000;
    auVar110._24_4_ = 0x3fc00000;
    auVar110._28_4_ = 0x3fc00000;
    auVar86 = vfmadd231ps_avx512vl(auVar122,auVar86,auVar110);
    auVar254 = ZEXT3264(auVar86);
    auVar89 = vmulps_avx512vl(auVar104,auVar86);
    auVar107 = vmulps_avx512vl(auVar105,auVar86);
    auVar108 = vmulps_avx512vl(auVar106,auVar86);
    auVar219 = ZEXT1632(auVar71);
    auVar109 = vsubps_avx512vl(auVar116,auVar219);
    auVar111 = vsubps_avx512vl(auVar116,auVar87);
    auVar110 = vsubps_avx512vl(auVar116,auVar88);
    auVar112 = vmulps_avx512vl(_local_7e0,auVar110);
    auVar112 = vfmadd231ps_avx512vl(auVar112,local_7c0,auVar111);
    auVar112 = vfmadd231ps_avx512vl(auVar112,local_7a0,auVar109);
    auVar113 = vmulps_avx512vl(auVar110,auVar110);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar111,auVar111);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar109,auVar109);
    auVar114 = vmulps_avx512vl(_local_7e0,auVar108);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar107,local_7c0);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar89,local_7a0);
    auVar108 = vmulps_avx512vl(auVar110,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar111,auVar107);
    auVar89 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar89);
    auVar107 = vmulps_avx512vl(auVar114,auVar114);
    auVar108 = vsubps_avx512vl(local_560,auVar107);
    auVar115 = vmulps_avx512vl(auVar114,auVar89);
    auVar112 = vsubps_avx512vl(auVar112,auVar115);
    auVar115 = vaddps_avx512vl(auVar112,auVar112);
    auVar112 = vmulps_avx512vl(auVar89,auVar89);
    auVar113 = vsubps_avx512vl(auVar113,auVar112);
    auVar103 = vsubps_avx512vl(auVar113,auVar103);
    local_800 = vmulps_avx512vl(auVar115,auVar115);
    auVar112._8_4_ = 0x40800000;
    auVar112._0_8_ = 0x4080000040800000;
    auVar112._12_4_ = 0x40800000;
    auVar112._16_4_ = 0x40800000;
    auVar112._20_4_ = 0x40800000;
    auVar112._24_4_ = 0x40800000;
    auVar112._28_4_ = 0x40800000;
    _local_820 = vmulps_avx512vl(auVar108,auVar112);
    auVar112 = vmulps_avx512vl(_local_820,auVar103);
    auVar112 = vsubps_avx512vl(local_800,auVar112);
    uVar67 = vcmpps_avx512vl(auVar112,auVar116,5);
    bVar52 = (byte)uVar67;
    if (bVar52 == 0) {
LAB_01b6de3e:
      auVar230 = ZEXT3264(_DAT_01f7b040);
      auVar245 = ZEXT3264(local_a00);
      auVar256 = ZEXT3264(local_a20);
      auVar252 = ZEXT3264(local_a40);
      auVar241 = ZEXT3264(local_a60);
      auVar153 = ZEXT3264(local_a80);
      auVar236 = ZEXT3264(local_aa0);
      auVar244 = ZEXT3264(local_ac0);
      auVar92 = vmovdqa64_avx512vl(auVar99);
      auVar255 = ZEXT3264(auVar92);
    }
    else {
      local_740._0_32_ = auVar113;
      auVar112 = vsqrtps_avx512vl(auVar112);
      auVar116 = vaddps_avx512vl(auVar108,auVar108);
      local_9a0 = vrcp14ps_avx512vl(auVar116);
      in_ZMM31 = ZEXT3264(local_9a0);
      auVar117 = vfnmadd213ps_avx512vl(local_9a0,auVar116,auVar257);
      auVar117 = vfmadd132ps_avx512vl(auVar117,local_9a0,local_9a0);
      auVar257._8_4_ = 0x80000000;
      auVar257._0_8_ = 0x8000000080000000;
      auVar257._12_4_ = 0x80000000;
      auVar257._16_4_ = 0x80000000;
      auVar257._20_4_ = 0x80000000;
      auVar257._24_4_ = 0x80000000;
      auVar257._28_4_ = 0x80000000;
      local_840 = vxorps_avx512vl(auVar115,auVar257);
      auVar118 = vsubps_avx512vl(local_840,auVar112);
      local_920 = vmulps_avx512vl(auVar118,auVar117);
      auVar112 = vsubps_avx512vl(auVar112,auVar115);
      local_9c0 = vmulps_avx512vl(auVar112,auVar117);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar117 = vblendmps_avx512vl(auVar112,local_920);
      auVar119._0_4_ =
           (uint)(bVar52 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar112._0_4_;
      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar64 * auVar117._4_4_ | (uint)!bVar64 * auVar112._4_4_;
      bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar64 * auVar117._8_4_ | (uint)!bVar64 * auVar112._8_4_;
      bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar64 * auVar117._12_4_ | (uint)!bVar64 * auVar112._12_4_;
      bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar64 * auVar117._16_4_ | (uint)!bVar64 * auVar112._16_4_;
      bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar64 * auVar117._20_4_ | (uint)!bVar64 * auVar112._20_4_;
      bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar64 * auVar117._24_4_ | (uint)!bVar64 * auVar112._24_4_;
      bVar64 = SUB81(uVar67 >> 7,0);
      auVar119._28_4_ = (uint)bVar64 * auVar117._28_4_ | (uint)!bVar64 * auVar112._28_4_;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar117 = vblendmps_avx512vl(auVar112,local_9c0);
      auVar120._0_4_ =
           (uint)(bVar52 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar112._0_4_;
      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar64 * auVar117._4_4_ | (uint)!bVar64 * auVar112._4_4_;
      bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar64 * auVar117._8_4_ | (uint)!bVar64 * auVar112._8_4_;
      bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar64 * auVar117._12_4_ | (uint)!bVar64 * auVar112._12_4_;
      bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar120._16_4_ = (uint)bVar64 * auVar117._16_4_ | (uint)!bVar64 * auVar112._16_4_;
      bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar120._20_4_ = (uint)bVar64 * auVar117._20_4_ | (uint)!bVar64 * auVar112._20_4_;
      bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar120._24_4_ = (uint)bVar64 * auVar117._24_4_ | (uint)!bVar64 * auVar112._24_4_;
      bVar64 = SUB81(uVar67 >> 7,0);
      auVar120._28_4_ = (uint)bVar64 * auVar117._28_4_ | (uint)!bVar64 * auVar112._28_4_;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar112);
      local_860 = vmaxps_avx512vl(local_580,auVar112);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      local_880 = vmulps_avx512vl(local_860,auVar32);
      vandps_avx512vl(auVar108,auVar112);
      uVar60 = vcmpps_avx512vl(local_880,local_880,1);
      uVar67 = uVar67 & uVar60;
      bVar61 = (byte)uVar67;
      if (bVar61 != 0) {
        uVar60 = vcmpps_avx512vl(auVar103,_DAT_01f7b000,2);
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar108 = vblendmps_avx512vl(auVar103,auVar107);
        bVar58 = (byte)uVar60;
        uVar68 = (uint)(bVar58 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar58 & 1) * local_880._0_4_;
        bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
        uVar132 = (uint)bVar64 * auVar108._4_4_ | (uint)!bVar64 * local_880._4_4_;
        bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
        uVar133 = (uint)bVar64 * auVar108._8_4_ | (uint)!bVar64 * local_880._8_4_;
        bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
        uVar134 = (uint)bVar64 * auVar108._12_4_ | (uint)!bVar64 * local_880._12_4_;
        bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
        uVar135 = (uint)bVar64 * auVar108._16_4_ | (uint)!bVar64 * local_880._16_4_;
        bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
        uVar136 = (uint)bVar64 * auVar108._20_4_ | (uint)!bVar64 * local_880._20_4_;
        bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
        uVar137 = (uint)bVar64 * auVar108._24_4_ | (uint)!bVar64 * local_880._24_4_;
        bVar64 = SUB81(uVar60 >> 7,0);
        uVar138 = (uint)bVar64 * auVar108._28_4_ | (uint)!bVar64 * local_880._28_4_;
        auVar119._0_4_ = (bVar61 & 1) * uVar68 | !(bool)(bVar61 & 1) * auVar119._0_4_;
        bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar119._4_4_ = bVar64 * uVar132 | !bVar64 * auVar119._4_4_;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar119._8_4_ = bVar64 * uVar133 | !bVar64 * auVar119._8_4_;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar119._12_4_ = bVar64 * uVar134 | !bVar64 * auVar119._12_4_;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar119._16_4_ = bVar64 * uVar135 | !bVar64 * auVar119._16_4_;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar119._20_4_ = bVar64 * uVar136 | !bVar64 * auVar119._20_4_;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar119._24_4_ = bVar64 * uVar137 | !bVar64 * auVar119._24_4_;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar119._28_4_ = bVar64 * uVar138 | !bVar64 * auVar119._28_4_;
        auVar103 = vblendmps_avx512vl(auVar107,auVar103);
        bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar15 = SUB81(uVar60 >> 7,0);
        auVar120._0_4_ =
             (uint)(bVar61 & 1) *
             ((uint)(bVar58 & 1) * auVar103._0_4_ | !(bool)(bVar58 & 1) * uVar68) |
             !(bool)(bVar61 & 1) * auVar120._0_4_;
        bVar9 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar120._4_4_ =
             (uint)bVar9 * ((uint)bVar64 * auVar103._4_4_ | !bVar64 * uVar132) |
             !bVar9 * auVar120._4_4_;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar120._8_4_ =
             (uint)bVar64 * ((uint)bVar10 * auVar103._8_4_ | !bVar10 * uVar133) |
             !bVar64 * auVar120._8_4_;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar120._12_4_ =
             (uint)bVar64 * ((uint)bVar11 * auVar103._12_4_ | !bVar11 * uVar134) |
             !bVar64 * auVar120._12_4_;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar120._16_4_ =
             (uint)bVar64 * ((uint)bVar12 * auVar103._16_4_ | !bVar12 * uVar135) |
             !bVar64 * auVar120._16_4_;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar120._20_4_ =
             (uint)bVar64 * ((uint)bVar13 * auVar103._20_4_ | !bVar13 * uVar136) |
             !bVar64 * auVar120._20_4_;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar120._24_4_ =
             (uint)bVar64 * ((uint)bVar14 * auVar103._24_4_ | !bVar14 * uVar137) |
             !bVar64 * auVar120._24_4_;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar120._28_4_ =
             (uint)bVar64 * ((uint)bVar15 * auVar103._28_4_ | !bVar15 * uVar138) |
             !bVar64 * auVar120._28_4_;
        bVar52 = (~bVar61 | bVar58) & bVar52;
      }
      if ((bVar52 & 0x7f) == 0) {
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar258 = ZEXT3264(auVar92);
        goto LAB_01b6de3e;
      }
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar94 = vxorps_avx512vl(auVar94,auVar103);
      auVar90 = vxorps_avx512vl(auVar90,auVar103);
      auVar230 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
      auVar93 = vxorps_avx512vl(auVar93,auVar103);
      auVar72 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                               ZEXT416((uint)local_970._0_4_));
      auVar107 = vbroadcastss_avx512vl(auVar72);
      auVar107 = vminps_avx512vl(auVar107,auVar120);
      auVar50._4_4_ = fStack_59c;
      auVar50._0_4_ = local_5a0;
      auVar50._8_4_ = fStack_598;
      auVar50._12_4_ = fStack_594;
      auVar50._16_4_ = fStack_590;
      auVar50._20_4_ = fStack_58c;
      auVar50._24_4_ = fStack_588;
      auVar50._28_4_ = fStack_584;
      auVar108 = vmaxps_avx512vl(auVar50,auVar119);
      auVar110 = vmulps_avx512vl(auVar110,auVar121);
      auVar111 = vfmadd213ps_avx512vl(auVar111,auVar251,auVar110);
      auVar72 = vfmadd213ps_fma(auVar109,auVar247,auVar111);
      in_ZMM31 = ZEXT3264(_local_7e0);
      auVar109 = vmulps_avx512vl(_local_7e0,auVar121);
      auVar109 = vfmadd231ps_avx512vl(auVar109,local_7c0,auVar251);
      auVar109 = vfmadd231ps_avx512vl(auVar109,local_7a0,auVar247);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar109,auVar111);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar18 = vcmpps_avx512vl(auVar111,auVar110,1);
      auVar112 = vxorps_avx512vl(ZEXT1632(auVar72),auVar103);
      auVar117 = vrcp14ps_avx512vl(auVar109);
      auVar121 = vxorps_avx512vl(auVar109,auVar103);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar122 = vfnmadd213ps_avx512vl(auVar117,auVar109,auVar118);
      auVar72 = vfmadd132ps_fma(auVar122,auVar117,auVar117);
      fVar154 = auVar72._0_4_ * auVar112._0_4_;
      fVar167 = auVar72._4_4_ * auVar112._4_4_;
      auVar38._4_4_ = fVar167;
      auVar38._0_4_ = fVar154;
      fVar168 = auVar72._8_4_ * auVar112._8_4_;
      auVar38._8_4_ = fVar168;
      fVar169 = auVar72._12_4_ * auVar112._12_4_;
      auVar38._12_4_ = fVar169;
      fVar171 = auVar112._16_4_ * 0.0;
      auVar38._16_4_ = fVar171;
      fVar170 = auVar112._20_4_ * 0.0;
      auVar38._20_4_ = fVar170;
      fVar172 = auVar112._24_4_ * 0.0;
      auVar38._24_4_ = fVar172;
      auVar38._28_4_ = auVar112._28_4_;
      uVar20 = vcmpps_avx512vl(auVar109,auVar121,1);
      bVar61 = (byte)uVar18 | (byte)uVar20;
      auVar253._8_4_ = 0xff800000;
      auVar253._0_8_ = 0xff800000ff800000;
      auVar253._12_4_ = 0xff800000;
      auVar253._16_4_ = 0xff800000;
      auVar253._20_4_ = 0xff800000;
      auVar253._24_4_ = 0xff800000;
      auVar253._28_4_ = 0xff800000;
      auVar122 = vblendmps_avx512vl(auVar38,auVar253);
      auVar123._0_4_ =
           (uint)(bVar61 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar117._0_4_;
      bVar64 = (bool)(bVar61 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar64 * auVar122._4_4_ | (uint)!bVar64 * auVar117._4_4_;
      bVar64 = (bool)(bVar61 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar64 * auVar122._8_4_ | (uint)!bVar64 * auVar117._8_4_;
      bVar64 = (bool)(bVar61 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar64 * auVar122._12_4_ | (uint)!bVar64 * auVar117._12_4_;
      bVar64 = (bool)(bVar61 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar64 * auVar122._16_4_ | (uint)!bVar64 * auVar117._16_4_;
      bVar64 = (bool)(bVar61 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar64 * auVar122._20_4_ | (uint)!bVar64 * auVar117._20_4_;
      bVar64 = (bool)(bVar61 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar64 * auVar122._24_4_ | (uint)!bVar64 * auVar117._24_4_;
      auVar123._28_4_ =
           (uint)(bVar61 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar117._28_4_;
      auVar108 = vmaxps_avx512vl(auVar108,auVar123);
      uVar20 = vcmpps_avx512vl(auVar109,auVar121,6);
      bVar61 = (byte)uVar18 | (byte)uVar20;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar124._0_4_ =
           (uint)(bVar61 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar61 & 1) * (int)fVar154;
      bVar64 = (bool)(bVar61 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar64 * auVar109._4_4_ | (uint)!bVar64 * (int)fVar167;
      bVar64 = (bool)(bVar61 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar64 * auVar109._8_4_ | (uint)!bVar64 * (int)fVar168;
      bVar64 = (bool)(bVar61 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar64 * auVar109._12_4_ | (uint)!bVar64 * (int)fVar169;
      bVar64 = (bool)(bVar61 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar64 * auVar109._16_4_ | (uint)!bVar64 * (int)fVar171;
      bVar64 = (bool)(bVar61 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar64 * auVar109._20_4_ | (uint)!bVar64 * (int)fVar170;
      bVar64 = (bool)(bVar61 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar64 * auVar109._24_4_ | (uint)!bVar64 * (int)fVar172;
      auVar124._28_4_ =
           (uint)(bVar61 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar112._28_4_;
      auVar112 = vminps_avx512vl(auVar107,auVar124);
      auVar73 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
      auVar83 = vsubps_avx512vl(ZEXT1632(auVar73),auVar83);
      auVar84 = vsubps_avx512vl(ZEXT1632(auVar73),auVar84);
      auVar85 = vsubps_avx512vl(ZEXT1632(auVar73),auVar85);
      auVar85 = vmulps_avx512vl(auVar85,auVar94);
      auVar84 = vfmadd231ps_avx512vl(auVar85,auVar93,auVar84);
      auVar83 = vfmadd231ps_avx512vl(auVar84,auVar90,auVar83);
      auVar84 = vmulps_avx512vl(_local_7e0,auVar94);
      auVar84 = vfmadd231ps_avx512vl(auVar84,local_7c0,auVar93);
      auVar84 = vfmadd231ps_avx512vl(auVar84,local_7a0,auVar90);
      vandps_avx512vl(auVar84,auVar111);
      uVar18 = vcmpps_avx512vl(auVar84,auVar110,1);
      auVar83 = vxorps_avx512vl(auVar83,auVar103);
      auVar85 = vrcp14ps_avx512vl(auVar84);
      auVar103 = vxorps_avx512vl(auVar84,auVar103);
      auVar90 = vfnmadd213ps_avx512vl(auVar85,auVar84,auVar118);
      auVar72 = vfmadd132ps_fma(auVar90,auVar85,auVar85);
      fVar154 = auVar72._0_4_ * auVar83._0_4_;
      fVar167 = auVar72._4_4_ * auVar83._4_4_;
      auVar39._4_4_ = fVar167;
      auVar39._0_4_ = fVar154;
      fVar168 = auVar72._8_4_ * auVar83._8_4_;
      auVar39._8_4_ = fVar168;
      fVar169 = auVar72._12_4_ * auVar83._12_4_;
      auVar39._12_4_ = fVar169;
      fVar171 = auVar83._16_4_ * 0.0;
      auVar39._16_4_ = fVar171;
      fVar170 = auVar83._20_4_ * 0.0;
      auVar39._20_4_ = fVar170;
      fVar172 = auVar83._24_4_ * 0.0;
      auVar39._24_4_ = fVar172;
      auVar39._28_4_ = auVar83._28_4_;
      uVar20 = vcmpps_avx512vl(auVar84,auVar103,1);
      bVar61 = (byte)uVar18 | (byte)uVar20;
      auVar90 = vblendmps_avx512vl(auVar39,auVar253);
      auVar125._0_4_ =
           (uint)(bVar61 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar85._0_4_;
      bVar64 = (bool)(bVar61 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar64 * auVar90._4_4_ | (uint)!bVar64 * auVar85._4_4_;
      bVar64 = (bool)(bVar61 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar64 * auVar90._8_4_ | (uint)!bVar64 * auVar85._8_4_;
      bVar64 = (bool)(bVar61 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar64 * auVar90._12_4_ | (uint)!bVar64 * auVar85._12_4_;
      bVar64 = (bool)(bVar61 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar64 * auVar90._16_4_ | (uint)!bVar64 * auVar85._16_4_;
      bVar64 = (bool)(bVar61 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar64 * auVar90._20_4_ | (uint)!bVar64 * auVar85._20_4_;
      bVar64 = (bool)(bVar61 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar64 * auVar90._24_4_ | (uint)!bVar64 * auVar85._24_4_;
      auVar125._28_4_ =
           (uint)(bVar61 >> 7) * auVar90._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar85._28_4_;
      local_780 = vmaxps_avx(auVar108,auVar125);
      uVar20 = vcmpps_avx512vl(auVar84,auVar103,6);
      bVar61 = (byte)uVar18 | (byte)uVar20;
      auVar126._0_4_ =
           (uint)(bVar61 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar61 & 1) * (int)fVar154;
      bVar64 = (bool)(bVar61 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar64 * auVar109._4_4_ | (uint)!bVar64 * (int)fVar167;
      bVar64 = (bool)(bVar61 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar64 * auVar109._8_4_ | (uint)!bVar64 * (int)fVar168;
      bVar64 = (bool)(bVar61 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar64 * auVar109._12_4_ | (uint)!bVar64 * (int)fVar169;
      bVar64 = (bool)(bVar61 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar64 * auVar109._16_4_ | (uint)!bVar64 * (int)fVar171;
      bVar64 = (bool)(bVar61 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar64 * auVar109._20_4_ | (uint)!bVar64 * (int)fVar170;
      bVar64 = (bool)(bVar61 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar64 * auVar109._24_4_ | (uint)!bVar64 * (int)fVar172;
      auVar126._28_4_ =
           (uint)(bVar61 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar83._28_4_;
      local_600 = vminps_avx(auVar112,auVar126);
      uVar18 = vcmpps_avx512vl(local_780,local_600,2);
      bVar52 = bVar52 & 0x7f & (byte)uVar18;
      if (bVar52 == 0) {
        auVar258 = ZEXT3264(auVar118);
        goto LAB_01b6de3e;
      }
      auVar103 = vmaxps_avx512vl(ZEXT1632(auVar73),auVar92);
      auVar92 = vfmadd213ps_avx512vl(local_920,auVar114,auVar89);
      fVar154 = auVar86._0_4_;
      fVar167 = auVar86._4_4_;
      auVar40._4_4_ = fVar167 * auVar92._4_4_;
      auVar40._0_4_ = fVar154 * auVar92._0_4_;
      fVar168 = auVar86._8_4_;
      auVar40._8_4_ = fVar168 * auVar92._8_4_;
      fVar169 = auVar86._12_4_;
      auVar40._12_4_ = fVar169 * auVar92._12_4_;
      fVar171 = auVar86._16_4_;
      auVar40._16_4_ = fVar171 * auVar92._16_4_;
      fVar170 = auVar86._20_4_;
      auVar40._20_4_ = fVar170 * auVar92._20_4_;
      fVar172 = auVar86._24_4_;
      auVar40._24_4_ = fVar172 * auVar92._24_4_;
      auVar40._28_4_ = auVar92._28_4_;
      auVar92 = vfmadd213ps_avx512vl(local_9c0,auVar114,auVar89);
      auVar41._4_4_ = fVar167 * auVar92._4_4_;
      auVar41._0_4_ = fVar154 * auVar92._0_4_;
      auVar41._8_4_ = fVar168 * auVar92._8_4_;
      auVar41._12_4_ = fVar169 * auVar92._12_4_;
      auVar41._16_4_ = fVar171 * auVar92._16_4_;
      auVar41._20_4_ = fVar170 * auVar92._20_4_;
      auVar41._24_4_ = fVar172 * auVar92._24_4_;
      auVar41._28_4_ = auVar92._28_4_;
      auVar92 = vminps_avx512vl(auVar40,auVar118);
      auVar83 = ZEXT832(0) << 0x20;
      auVar92 = vmaxps_avx(auVar92,ZEXT832(0) << 0x20);
      auVar84 = vminps_avx512vl(auVar41,auVar118);
      auVar42._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar42._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar42._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar42._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar42._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar42._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar42._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar42._28_4_ = auVar92._28_4_ + 7.0;
      local_520 = vfmadd213ps_avx512vl(auVar42,auVar212,auVar195);
      auVar92 = vmaxps_avx(auVar84,ZEXT832(0) << 0x20);
      auVar43._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar43._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar43._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar43._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar43._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar43._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar43._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar43._28_4_ = auVar92._28_4_ + 7.0;
      local_540 = vfmadd213ps_avx512vl(auVar43,auVar212,auVar195);
      auVar44._4_4_ = auVar103._4_4_ * auVar103._4_4_;
      auVar44._0_4_ = auVar103._0_4_ * auVar103._0_4_;
      auVar44._8_4_ = auVar103._8_4_ * auVar103._8_4_;
      auVar44._12_4_ = auVar103._12_4_ * auVar103._12_4_;
      auVar44._16_4_ = auVar103._16_4_ * auVar103._16_4_;
      auVar44._20_4_ = auVar103._20_4_ * auVar103._20_4_;
      auVar44._24_4_ = auVar103._24_4_ * auVar103._24_4_;
      auVar44._28_4_ = auVar103._28_4_;
      auVar92 = vsubps_avx(auVar113,auVar44);
      auVar45._4_4_ = auVar92._4_4_ * (float)local_820._4_4_;
      auVar45._0_4_ = auVar92._0_4_ * (float)local_820._0_4_;
      auVar45._8_4_ = auVar92._8_4_ * fStack_818;
      auVar45._12_4_ = auVar92._12_4_ * fStack_814;
      auVar45._16_4_ = auVar92._16_4_ * fStack_810;
      auVar45._20_4_ = auVar92._20_4_ * fStack_80c;
      auVar45._24_4_ = auVar92._24_4_ * fStack_808;
      auVar45._28_4_ = auVar103._28_4_;
      auVar103 = vsubps_avx(local_800,auVar45);
      uVar18 = vcmpps_avx512vl(auVar103,ZEXT832(0) << 0x20,5);
      bVar61 = (byte)uVar18;
      if (bVar61 == 0) {
        bVar61 = 0;
        auVar104 = ZEXT832(0) << 0x20;
        auVar153 = ZEXT864(0) << 0x20;
        auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar84 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar246 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar127._8_4_ = 0x7f800000;
        auVar127._0_8_ = 0x7f8000007f800000;
        auVar127._12_4_ = 0x7f800000;
        auVar127._16_4_ = 0x7f800000;
        auVar127._20_4_ = 0x7f800000;
        auVar127._24_4_ = 0x7f800000;
        auVar127._28_4_ = 0x7f800000;
        auVar128._8_4_ = 0xff800000;
        auVar128._0_8_ = 0xff800000ff800000;
        auVar128._12_4_ = 0xff800000;
        auVar128._16_4_ = 0xff800000;
        auVar128._20_4_ = 0xff800000;
        auVar128._24_4_ = 0xff800000;
        auVar128._28_4_ = 0xff800000;
      }
      else {
        auVar73 = vxorps_avx512vl(auVar199,auVar199);
        uVar67 = vcmpps_avx512vl(auVar103,ZEXT1232(ZEXT812(0)) << 0x20,5);
        auVar103 = vsqrtps_avx(auVar103);
        auVar83 = vfnmadd213ps_avx512vl(auVar116,local_9a0,auVar118);
        auVar85 = vfmadd132ps_avx512vl(auVar83,local_9a0,local_9a0);
        auVar83 = vsubps_avx(local_840,auVar103);
        auVar90 = vmulps_avx512vl(auVar83,auVar85);
        auVar103 = vsubps_avx512vl(auVar103,auVar115);
        auVar85 = vmulps_avx512vl(auVar103,auVar85);
        auVar103 = vfmadd213ps_avx512vl(auVar114,auVar90,auVar89);
        auVar46._4_4_ = fVar167 * auVar103._4_4_;
        auVar46._0_4_ = fVar154 * auVar103._0_4_;
        auVar46._8_4_ = fVar168 * auVar103._8_4_;
        auVar46._12_4_ = fVar169 * auVar103._12_4_;
        auVar46._16_4_ = fVar171 * auVar103._16_4_;
        auVar46._20_4_ = fVar170 * auVar103._20_4_;
        auVar46._24_4_ = fVar172 * auVar103._24_4_;
        auVar46._28_4_ = auVar84._28_4_;
        auVar103 = vmulps_avx512vl(local_7a0,auVar90);
        auVar83 = vmulps_avx512vl(local_7c0,auVar90);
        auVar93 = vmulps_avx512vl(_local_7e0,auVar90);
        auVar84 = vfmadd213ps_avx512vl(auVar104,auVar46,auVar219);
        auVar103 = vsubps_avx512vl(auVar103,auVar84);
        auVar84 = vfmadd213ps_avx512vl(auVar105,auVar46,auVar87);
        auVar84 = vsubps_avx512vl(auVar83,auVar84);
        auVar72 = vfmadd213ps_fma(auVar46,auVar106,auVar88);
        auVar83 = vsubps_avx(auVar93,ZEXT1632(auVar72));
        auVar246 = auVar83._0_28_;
        auVar83 = vfmadd213ps_avx512vl(auVar114,auVar85,auVar89);
        auVar86 = vmulps_avx512vl(auVar86,auVar83);
        auVar254 = ZEXT3264(auVar86);
        auVar83 = vmulps_avx512vl(local_7a0,auVar85);
        auVar89 = vmulps_avx512vl(local_7c0,auVar85);
        auVar93 = vmulps_avx512vl(_local_7e0,auVar85);
        auVar72 = vfmadd213ps_fma(auVar104,auVar86,auVar219);
        auVar83 = vsubps_avx(auVar83,ZEXT1632(auVar72));
        auVar72 = vfmadd213ps_fma(auVar105,auVar86,auVar87);
        auVar104 = vsubps_avx512vl(auVar89,ZEXT1632(auVar72));
        auVar72 = vfmadd213ps_fma(auVar106,auVar86,auVar88);
        auVar105 = vsubps_avx512vl(auVar93,ZEXT1632(auVar72));
        auVar153 = ZEXT3264(auVar105);
        auVar196._8_4_ = 0x7f800000;
        auVar196._0_8_ = 0x7f8000007f800000;
        auVar196._12_4_ = 0x7f800000;
        auVar196._16_4_ = 0x7f800000;
        auVar196._20_4_ = 0x7f800000;
        auVar196._24_4_ = 0x7f800000;
        auVar196._28_4_ = 0x7f800000;
        auVar105 = vblendmps_avx512vl(auVar196,auVar90);
        bVar64 = (bool)((byte)uVar67 & 1);
        auVar127._0_4_ = (uint)bVar64 * auVar105._0_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar64 * auVar105._4_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar64 * auVar105._8_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar64 * auVar105._12_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar127._16_4_ = (uint)bVar64 * auVar105._16_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar127._20_4_ = (uint)bVar64 * auVar105._20_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar127._24_4_ = (uint)bVar64 * auVar105._24_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar127._28_4_ = (uint)bVar64 * auVar105._28_4_ | (uint)!bVar64 * 0x7f800000;
        auVar220._8_4_ = 0xff800000;
        auVar220._0_8_ = 0xff800000ff800000;
        auVar220._12_4_ = 0xff800000;
        auVar220._16_4_ = 0xff800000;
        auVar220._20_4_ = 0xff800000;
        auVar220._24_4_ = 0xff800000;
        auVar220._28_4_ = 0xff800000;
        auVar105 = vblendmps_avx512vl(auVar220,auVar85);
        bVar64 = (bool)((byte)uVar67 & 1);
        auVar128._0_4_ = (uint)bVar64 * auVar105._0_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar64 * auVar105._4_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar64 * auVar105._8_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar64 * auVar105._12_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar128._16_4_ = (uint)bVar64 * auVar105._16_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar128._20_4_ = (uint)bVar64 * auVar105._20_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar128._24_4_ = (uint)bVar64 * auVar105._24_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar128._28_4_ = (uint)bVar64 * auVar105._28_4_ | (uint)!bVar64 * -0x800000;
        auVar33._8_4_ = 0x36000000;
        auVar33._0_8_ = 0x3600000036000000;
        auVar33._12_4_ = 0x36000000;
        auVar33._16_4_ = 0x36000000;
        auVar33._20_4_ = 0x36000000;
        auVar33._24_4_ = 0x36000000;
        auVar33._28_4_ = 0x36000000;
        auVar105 = vmulps_avx512vl(local_860,auVar33);
        uVar60 = vcmpps_avx512vl(auVar105,local_880,0xe);
        uVar67 = uVar67 & uVar60;
        bVar58 = (byte)uVar67;
        if (bVar58 != 0) {
          uVar60 = vcmpps_avx512vl(auVar92,ZEXT1632(auVar73),2);
          auVar243._8_4_ = 0x7f800000;
          auVar243._0_8_ = 0x7f8000007f800000;
          auVar243._12_4_ = 0x7f800000;
          auVar243._16_4_ = 0x7f800000;
          auVar243._20_4_ = 0x7f800000;
          auVar243._24_4_ = 0x7f800000;
          auVar243._28_4_ = 0x7f800000;
          auVar248._8_4_ = 0xff800000;
          auVar248._0_8_ = 0xff800000ff800000;
          auVar248._12_4_ = 0xff800000;
          auVar248._16_4_ = 0xff800000;
          auVar248._20_4_ = 0xff800000;
          auVar248._24_4_ = 0xff800000;
          auVar248._28_4_ = 0xff800000;
          auVar92 = vblendmps_avx512vl(auVar243,auVar248);
          bVar53 = (byte)uVar60;
          uVar68 = (uint)(bVar53 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar105._0_4_;
          bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
          uVar132 = (uint)bVar64 * auVar92._4_4_ | (uint)!bVar64 * auVar105._4_4_;
          bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
          uVar133 = (uint)bVar64 * auVar92._8_4_ | (uint)!bVar64 * auVar105._8_4_;
          bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
          uVar134 = (uint)bVar64 * auVar92._12_4_ | (uint)!bVar64 * auVar105._12_4_;
          bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
          uVar135 = (uint)bVar64 * auVar92._16_4_ | (uint)!bVar64 * auVar105._16_4_;
          bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
          uVar136 = (uint)bVar64 * auVar92._20_4_ | (uint)!bVar64 * auVar105._20_4_;
          bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
          uVar137 = (uint)bVar64 * auVar92._24_4_ | (uint)!bVar64 * auVar105._24_4_;
          bVar64 = SUB81(uVar60 >> 7,0);
          uVar138 = (uint)bVar64 * auVar92._28_4_ | (uint)!bVar64 * auVar105._28_4_;
          auVar127._0_4_ = (bVar58 & 1) * uVar68 | !(bool)(bVar58 & 1) * auVar127._0_4_;
          bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar127._4_4_ = bVar64 * uVar132 | !bVar64 * auVar127._4_4_;
          bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar127._8_4_ = bVar64 * uVar133 | !bVar64 * auVar127._8_4_;
          bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar127._12_4_ = bVar64 * uVar134 | !bVar64 * auVar127._12_4_;
          bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar127._16_4_ = bVar64 * uVar135 | !bVar64 * auVar127._16_4_;
          bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar127._20_4_ = bVar64 * uVar136 | !bVar64 * auVar127._20_4_;
          bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar127._24_4_ = bVar64 * uVar137 | !bVar64 * auVar127._24_4_;
          bVar64 = SUB81(uVar67 >> 7,0);
          auVar127._28_4_ = bVar64 * uVar138 | !bVar64 * auVar127._28_4_;
          auVar92 = vblendmps_avx512vl(auVar248,auVar243);
          bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          bVar11 = (bool)((byte)(uVar60 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
          bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
          bVar14 = (bool)((byte)(uVar60 >> 6) & 1);
          bVar15 = SUB81(uVar60 >> 7,0);
          auVar128._0_4_ =
               (uint)(bVar58 & 1) *
               ((uint)(bVar53 & 1) * auVar92._0_4_ | !(bool)(bVar53 & 1) * uVar68) |
               !(bool)(bVar58 & 1) * auVar128._0_4_;
          bVar9 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar128._4_4_ =
               (uint)bVar9 * ((uint)bVar64 * auVar92._4_4_ | !bVar64 * uVar132) |
               !bVar9 * auVar128._4_4_;
          bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar128._8_4_ =
               (uint)bVar64 * ((uint)bVar10 * auVar92._8_4_ | !bVar10 * uVar133) |
               !bVar64 * auVar128._8_4_;
          bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar128._12_4_ =
               (uint)bVar64 * ((uint)bVar11 * auVar92._12_4_ | !bVar11 * uVar134) |
               !bVar64 * auVar128._12_4_;
          bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar128._16_4_ =
               (uint)bVar64 * ((uint)bVar12 * auVar92._16_4_ | !bVar12 * uVar135) |
               !bVar64 * auVar128._16_4_;
          bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar128._20_4_ =
               (uint)bVar64 * ((uint)bVar13 * auVar92._20_4_ | !bVar13 * uVar136) |
               !bVar64 * auVar128._20_4_;
          bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar128._24_4_ =
               (uint)bVar64 * ((uint)bVar14 * auVar92._24_4_ | !bVar14 * uVar137) |
               !bVar64 * auVar128._24_4_;
          bVar64 = SUB81(uVar67 >> 7,0);
          auVar128._28_4_ =
               (uint)bVar64 * ((uint)bVar15 * auVar92._28_4_ | !bVar15 * uVar138) |
               !bVar64 * auVar128._28_4_;
          bVar61 = (~bVar58 | bVar53) & bVar61;
        }
      }
      auVar92 = vmovdqa64_avx512vl(auVar99);
      auVar255 = ZEXT3264(auVar92);
      auVar236._0_4_ = (float)local_7e0._0_4_ * auVar153._0_4_;
      auVar236._4_4_ = (float)local_7e0._4_4_ * auVar153._4_4_;
      auVar236._8_4_ = fStack_7d8 * auVar153._8_4_;
      auVar236._12_4_ = fStack_7d4 * auVar153._12_4_;
      auVar236._16_4_ = fStack_7d0 * auVar153._16_4_;
      auVar236._20_4_ = fStack_7cc * auVar153._20_4_;
      auVar236._28_36_ = auVar153._28_36_;
      auVar236._24_4_ = fStack_7c8 * auVar153._24_4_;
      auVar72 = vfmadd231ps_fma(auVar236._0_32_,local_7c0,auVar104);
      auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),local_7a0,auVar83);
      auVar240._8_4_ = 0x7fffffff;
      auVar240._0_8_ = 0x7fffffff7fffffff;
      auVar240._12_4_ = 0x7fffffff;
      auVar240._16_4_ = 0x7fffffff;
      auVar240._20_4_ = 0x7fffffff;
      auVar240._24_4_ = 0x7fffffff;
      auVar240._28_4_ = 0x7fffffff;
      auVar92 = vandps_avx(ZEXT1632(auVar72),auVar240);
      _local_440 = local_780;
      auVar235._8_4_ = 0x3e99999a;
      auVar235._0_8_ = 0x3e99999a3e99999a;
      auVar235._12_4_ = 0x3e99999a;
      auVar235._16_4_ = 0x3e99999a;
      auVar235._20_4_ = 0x3e99999a;
      auVar235._24_4_ = 0x3e99999a;
      auVar235._28_4_ = 0x3e99999a;
      uVar18 = vcmpps_avx512vl(auVar92,auVar235,1);
      _local_6a0 = vmaxps_avx(local_780,auVar128);
      auVar92 = vminps_avx(local_600,auVar127);
      uVar20 = vcmpps_avx512vl(local_780,auVar92,2);
      bVar58 = (byte)uVar20 & bVar52;
      uVar19 = vcmpps_avx512vl(_local_6a0,local_600,2);
      if ((bVar52 & ((byte)uVar19 | (byte)uVar20)) == 0) {
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar258 = ZEXT3264(auVar92);
        auVar230 = ZEXT3264(_DAT_01f7b040);
        auVar245 = ZEXT3264(local_a00);
        auVar256 = ZEXT3264(local_a20);
        auVar252 = ZEXT3264(local_a40);
        auVar241 = ZEXT3264(local_a60);
        auVar153 = ZEXT3264(local_a80);
        auVar236 = ZEXT3264(local_aa0);
        auVar244 = ZEXT3264(local_ac0);
      }
      else {
        bVar53 = (byte)uVar18 | ~bVar61;
        auVar47._4_4_ = (float)local_7e0._4_4_ * auVar246._4_4_;
        auVar47._0_4_ = (float)local_7e0._0_4_ * auVar246._0_4_;
        auVar47._8_4_ = fStack_7d8 * auVar246._8_4_;
        auVar47._12_4_ = fStack_7d4 * auVar246._12_4_;
        auVar47._16_4_ = fStack_7d0 * auVar246._16_4_;
        auVar47._20_4_ = fStack_7cc * auVar246._20_4_;
        auVar47._24_4_ = fStack_7c8 * auVar246._24_4_;
        auVar47._28_4_ = auVar92._28_4_;
        auVar72 = vfmadd213ps_fma(auVar84,local_7c0,auVar47);
        auVar72 = vfmadd213ps_fma(auVar103,local_7a0,ZEXT1632(auVar72));
        auVar92 = vandps_avx(ZEXT1632(auVar72),auVar240);
        uVar18 = vcmpps_avx512vl(auVar92,auVar235,1);
        bVar61 = (byte)uVar18 | ~bVar61;
        auVar148._8_4_ = 2;
        auVar148._0_8_ = 0x200000002;
        auVar148._12_4_ = 2;
        auVar148._16_4_ = 2;
        auVar148._20_4_ = 2;
        auVar148._24_4_ = 2;
        auVar148._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar92 = vpblendmd_avx512vl(auVar148,auVar34);
        local_5e0._0_4_ = (uint)(bVar61 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
        bVar64 = (bool)(bVar61 >> 1 & 1);
        local_5e0._4_4_ = (uint)bVar64 * auVar92._4_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar61 >> 2 & 1);
        local_5e0._8_4_ = (uint)bVar64 * auVar92._8_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar61 >> 3 & 1);
        local_5e0._12_4_ = (uint)bVar64 * auVar92._12_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar61 >> 4 & 1);
        local_5e0._16_4_ = (uint)bVar64 * auVar92._16_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar61 >> 5 & 1);
        local_5e0._20_4_ = (uint)bVar64 * auVar92._20_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar61 >> 6 & 1);
        local_5e0._24_4_ = (uint)bVar64 * auVar92._24_4_ | (uint)!bVar64 * 2;
        local_5e0._28_4_ = (uint)(bVar61 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2;
        local_640 = vpbroadcastd_avx512vl();
        uVar18 = vpcmpd_avx512vl(local_640,local_5e0,5);
        local_680 = local_780._0_4_ + (float)local_760._0_4_;
        fStack_67c = local_780._4_4_ + (float)local_760._4_4_;
        fStack_678 = local_780._8_4_ + fStack_758;
        fStack_674 = local_780._12_4_ + fStack_754;
        fStack_670 = local_780._16_4_ + fStack_750;
        fStack_66c = local_780._20_4_ + fStack_74c;
        fStack_668 = local_780._24_4_ + fStack_748;
        fStack_664 = local_780._28_4_ + fStack_744;
        _local_620 = _local_6a0;
        for (bVar61 = (byte)uVar18 & bVar58; bVar61 != 0; bVar61 = ~bVar59 & bVar61 & (byte)uVar18)
        {
          auVar149._8_4_ = 0x7f800000;
          auVar149._0_8_ = 0x7f8000007f800000;
          auVar149._12_4_ = 0x7f800000;
          auVar149._16_4_ = 0x7f800000;
          auVar149._20_4_ = 0x7f800000;
          auVar149._24_4_ = 0x7f800000;
          auVar149._28_4_ = 0x7f800000;
          auVar92 = vblendmps_avx512vl(auVar149,local_780);
          auVar130._0_4_ =
               (uint)(bVar61 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
          bVar64 = (bool)(bVar61 >> 1 & 1);
          auVar130._4_4_ = (uint)bVar64 * auVar92._4_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar61 >> 2 & 1);
          auVar130._8_4_ = (uint)bVar64 * auVar92._8_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar61 >> 3 & 1);
          auVar130._12_4_ = (uint)bVar64 * auVar92._12_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar61 >> 4 & 1);
          auVar130._16_4_ = (uint)bVar64 * auVar92._16_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar61 >> 5 & 1);
          auVar130._20_4_ = (uint)bVar64 * auVar92._20_4_ | (uint)!bVar64 * 0x7f800000;
          auVar130._24_4_ =
               (uint)(bVar61 >> 6) * auVar92._24_4_ | (uint)!(bool)(bVar61 >> 6) * 0x7f800000;
          auVar130._28_4_ = 0x7f800000;
          auVar92 = vshufps_avx(auVar130,auVar130,0xb1);
          auVar92 = vminps_avx(auVar130,auVar92);
          auVar103 = vshufpd_avx(auVar92,auVar92,5);
          auVar92 = vminps_avx(auVar92,auVar103);
          auVar103 = vpermpd_avx2(auVar92,0x4e);
          auVar92 = vminps_avx(auVar92,auVar103);
          uVar18 = vcmpps_avx512vl(auVar130,auVar92,0);
          bVar54 = (byte)uVar18 & bVar61;
          bVar59 = bVar61;
          if (bVar54 != 0) {
            bVar59 = bVar54;
          }
          iVar21 = 0;
          for (uVar68 = (uint)bVar59; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
            iVar21 = iVar21 + 1;
          }
          bVar59 = '\x01' << ((byte)iVar21 & 0x1f);
          uVar68 = *(uint *)(local_520 + (uint)(iVar21 << 2));
          uVar132 = *(uint *)(local_440 + (uint)(iVar21 << 2));
          fVar154 = auVar69._0_4_;
          if ((float)local_9e0._0_4_ < 0.0) {
            auVar254 = ZEXT1664(auVar254._0_16_);
            fVar154 = sqrtf((float)local_9e0._0_4_);
            auVar92 = vmovdqa64_avx512vl(auVar99);
            auVar255 = ZEXT3264(auVar92);
          }
          uVar67 = (ulong)bVar59;
          auVar73 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar72 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar74 = vminps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar81 = vminps_avx(auVar73,auVar74);
          auVar73 = vmaxps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar74 = vmaxps_avx(auVar72,auVar73);
          auVar200._8_4_ = 0x7fffffff;
          auVar200._0_8_ = 0x7fffffff7fffffff;
          auVar200._12_4_ = 0x7fffffff;
          auVar72 = vandps_avx(auVar81,auVar200);
          auVar73 = vandps_avx(auVar74,auVar200);
          auVar72 = vmaxps_avx(auVar72,auVar73);
          auVar73 = vmovshdup_avx(auVar72);
          auVar73 = vmaxss_avx(auVar73,auVar72);
          auVar72 = vshufpd_avx(auVar72,auVar72,1);
          auVar72 = vmaxss_avx(auVar72,auVar73);
          fVar167 = auVar72._0_4_ * 1.9073486e-06;
          local_960 = vshufps_avx(auVar74,auVar74,0xff);
          auVar72 = vinsertps_avx(ZEXT416(uVar132),ZEXT416(uVar68),0x10);
          auVar153 = ZEXT1664(auVar72);
          uVar60 = 0;
          while( true ) {
            bVar54 = (byte)uVar67;
            if (uVar60 == 5) break;
            uVar155 = auVar153._0_4_;
            auVar140._4_4_ = uVar155;
            auVar140._0_4_ = uVar155;
            auVar140._8_4_ = uVar155;
            auVar140._12_4_ = uVar155;
            auVar73 = vfmadd132ps_fma(auVar140,ZEXT816(0) << 0x40,local_9d0);
            auVar74 = auVar153._0_16_;
            auVar72 = vmovshdup_avx(auVar74);
            local_920._0_16_ = auVar72;
            fVar172 = 1.0 - auVar72._0_4_;
            auVar72 = vshufps_avx(auVar74,auVar74,0x55);
            fVar168 = auVar72._0_4_;
            auVar176._0_4_ = local_8e0._0_4_ * fVar168;
            fVar169 = auVar72._4_4_;
            auVar176._4_4_ = local_8e0._4_4_ * fVar169;
            fVar171 = auVar72._8_4_;
            auVar176._8_4_ = local_8e0._8_4_ * fVar171;
            fVar170 = auVar72._12_4_;
            auVar176._12_4_ = local_8e0._12_4_ * fVar170;
            _local_820 = ZEXT416((uint)fVar172);
            auVar201._4_4_ = fVar172;
            auVar201._0_4_ = fVar172;
            auVar201._8_4_ = fVar172;
            auVar201._12_4_ = fVar172;
            auVar72 = vfmadd231ps_fma(auVar176,auVar201,local_8a0._0_16_);
            auVar215._0_4_ = local_8c0._0_4_ * fVar168;
            auVar215._4_4_ = local_8c0._4_4_ * fVar169;
            auVar215._8_4_ = local_8c0._8_4_ * fVar171;
            auVar215._12_4_ = local_8c0._12_4_ * fVar170;
            auVar74 = vfmadd231ps_fma(auVar215,auVar201,local_8e0._0_16_);
            auVar223._0_4_ = fVar168 * (float)local_900._0_4_;
            auVar223._4_4_ = fVar169 * (float)local_900._4_4_;
            auVar223._8_4_ = fVar171 * fStack_8f8;
            auVar223._12_4_ = fVar170 * fStack_8f4;
            auVar81 = vfmadd231ps_fma(auVar223,auVar201,local_8c0._0_16_);
            auVar232._0_4_ = fVar168 * auVar74._0_4_;
            auVar232._4_4_ = fVar169 * auVar74._4_4_;
            auVar232._8_4_ = fVar171 * auVar74._8_4_;
            auVar232._12_4_ = fVar170 * auVar74._12_4_;
            auVar72 = vfmadd231ps_fma(auVar232,auVar201,auVar72);
            auVar177._0_4_ = fVar168 * auVar81._0_4_;
            auVar177._4_4_ = fVar169 * auVar81._4_4_;
            auVar177._8_4_ = fVar171 * auVar81._8_4_;
            auVar177._12_4_ = fVar170 * auVar81._12_4_;
            auVar74 = vfmadd231ps_fma(auVar177,auVar201,auVar74);
            auVar216._0_4_ = fVar168 * auVar74._0_4_;
            auVar216._4_4_ = fVar169 * auVar74._4_4_;
            auVar216._8_4_ = fVar171 * auVar74._8_4_;
            auVar216._12_4_ = fVar170 * auVar74._12_4_;
            auVar81 = vfmadd231ps_fma(auVar216,auVar72,auVar201);
            auVar72 = vsubps_avx(auVar74,auVar72);
            auVar22._8_4_ = 0x40400000;
            auVar22._0_8_ = 0x4040000040400000;
            auVar22._12_4_ = 0x40400000;
            auVar74 = vmulps_avx512vl(auVar72,auVar22);
            local_800._0_16_ = auVar81;
            auVar73 = vsubps_avx(auVar73,auVar81);
            auVar72 = vdpps_avx(auVar73,auVar73,0x7f);
            fVar168 = auVar72._0_4_;
            local_740 = auVar153;
            if (fVar168 < 0.0) {
              auVar244._0_4_ = sqrtf(fVar168);
              auVar244._4_60_ = extraout_var;
              auVar81 = auVar244._0_16_;
              uVar67 = extraout_RAX;
            }
            else {
              auVar81 = vsqrtss_avx(auVar72,auVar72);
            }
            local_840._0_16_ = vdpps_avx(auVar74,auVar74,0x7f);
            fVar169 = local_840._0_4_;
            auVar178._4_12_ = ZEXT812(0) << 0x20;
            auVar178._0_4_ = fVar169;
            local_9a0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
            fVar171 = local_9a0._0_4_;
            local_860._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar71 = vxorps_avx512vl(local_840._0_16_,auVar23);
            auVar80 = vfnmadd213ss_fma(local_860._0_16_,local_840._0_16_,ZEXT416(0x40000000));
            local_880._0_4_ = auVar80._0_4_;
            local_9c0._0_4_ = auVar81._0_4_;
            if (fVar169 < auVar71._0_4_) {
              fVar170 = sqrtf(fVar169);
              auVar81 = ZEXT416((uint)local_9c0._0_4_);
              uVar67 = extraout_RAX_00;
            }
            else {
              auVar80 = vsqrtss_avx(local_840._0_16_,local_840._0_16_);
              fVar170 = auVar80._0_4_;
            }
            fVar172 = local_9a0._0_4_;
            fVar169 = fVar171 * 1.5 + fVar169 * -0.5 * fVar172 * fVar172 * fVar172;
            local_9a0._0_4_ = auVar74._0_4_ * fVar169;
            local_9a0._4_4_ = auVar74._4_4_ * fVar169;
            local_9a0._8_4_ = auVar74._8_4_ * fVar169;
            local_9a0._12_4_ = auVar74._12_4_ * fVar169;
            auVar80 = vdpps_avx(auVar73,local_9a0._0_16_,0x7f);
            fVar173 = auVar81._0_4_;
            fVar171 = auVar80._0_4_;
            auVar141._0_4_ = fVar171 * fVar171;
            auVar141._4_4_ = auVar80._4_4_ * auVar80._4_4_;
            auVar141._8_4_ = auVar80._8_4_ * auVar80._8_4_;
            auVar141._12_4_ = auVar80._12_4_ * auVar80._12_4_;
            auVar75 = vsubps_avx512vl(auVar72,auVar141);
            fVar172 = auVar75._0_4_;
            auVar157._4_12_ = ZEXT812(0) << 0x20;
            auVar157._0_4_ = fVar172;
            auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar157);
            auVar76 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
            auVar77 = vmulss_avx512f(auVar75,ZEXT416(0xbf000000));
            if (fVar172 < 0.0) {
              local_950 = fVar169;
              fStack_94c = fVar169;
              fStack_948 = fVar169;
              fStack_944 = fVar169;
              local_940 = auVar71;
              fVar172 = sqrtf(fVar172);
              auVar77 = ZEXT416(auVar77._0_4_);
              auVar76 = ZEXT416(auVar76._0_4_);
              auVar81 = ZEXT416((uint)local_9c0._0_4_);
              uVar67 = extraout_RAX_01;
              auVar71 = local_940;
              fVar169 = local_950;
              fVar249 = fStack_94c;
              fVar175 = fStack_948;
              fVar250 = fStack_944;
            }
            else {
              auVar75 = vsqrtss_avx(auVar75,auVar75);
              fVar172 = auVar75._0_4_;
              fVar249 = fVar169;
              fVar175 = fVar169;
              fVar250 = fVar169;
            }
            auVar254 = ZEXT1664(auVar71);
            auVar92 = vmovdqa64_avx512vl(auVar99);
            auVar255 = ZEXT3264(auVar92);
            auVar139 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_820,local_920._0_16_);
            auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920._0_16_,_local_820);
            fVar174 = auVar75._0_4_ * 6.0;
            fVar17 = local_920._0_4_ * 6.0;
            auVar202._0_4_ = fVar17 * (float)local_900._0_4_;
            auVar202._4_4_ = fVar17 * (float)local_900._4_4_;
            auVar202._8_4_ = fVar17 * fStack_8f8;
            auVar202._12_4_ = fVar17 * fStack_8f4;
            auVar179._4_4_ = fVar174;
            auVar179._0_4_ = fVar174;
            auVar179._8_4_ = fVar174;
            auVar179._12_4_ = fVar174;
            auVar75 = vfmadd132ps_fma(auVar179,auVar202,local_8c0._0_16_);
            fVar174 = auVar139._0_4_ * 6.0;
            auVar158._4_4_ = fVar174;
            auVar158._0_4_ = fVar174;
            auVar158._8_4_ = fVar174;
            auVar158._12_4_ = fVar174;
            auVar75 = vfmadd132ps_fma(auVar158,auVar75,local_8e0._0_16_);
            fVar174 = local_820._0_4_ * 6.0;
            auVar180._4_4_ = fVar174;
            auVar180._0_4_ = fVar174;
            auVar180._8_4_ = fVar174;
            auVar180._12_4_ = fVar174;
            auVar75 = vfmadd132ps_fma(auVar180,auVar75,local_8a0._0_16_);
            auVar159._0_4_ = auVar75._0_4_ * (float)local_840._0_4_;
            auVar159._4_4_ = auVar75._4_4_ * (float)local_840._0_4_;
            auVar159._8_4_ = auVar75._8_4_ * (float)local_840._0_4_;
            auVar159._12_4_ = auVar75._12_4_ * (float)local_840._0_4_;
            auVar75 = vdpps_avx(auVar74,auVar75,0x7f);
            fVar174 = auVar75._0_4_;
            auVar181._0_4_ = auVar74._0_4_ * fVar174;
            auVar181._4_4_ = auVar74._4_4_ * fVar174;
            auVar181._8_4_ = auVar74._8_4_ * fVar174;
            auVar181._12_4_ = auVar74._12_4_ * fVar174;
            auVar75 = vsubps_avx(auVar159,auVar181);
            fVar174 = (float)local_880._0_4_ * (float)local_860._0_4_;
            auVar139 = vmaxss_avx(ZEXT416((uint)fVar167),
                                  ZEXT416((uint)(local_740._0_4_ * fVar154 * 1.9073486e-06)));
            auVar24._8_4_ = 0x80000000;
            auVar24._0_8_ = 0x8000000080000000;
            auVar24._12_4_ = 0x80000000;
            auVar245._16_48_ = local_740._16_48_;
            auVar78 = vxorps_avx512vl(auVar74,auVar24);
            auVar182._0_4_ = fVar169 * auVar75._0_4_ * fVar174;
            auVar182._4_4_ = fVar249 * auVar75._4_4_ * fVar174;
            auVar182._8_4_ = fVar175 * auVar75._8_4_ * fVar174;
            auVar182._12_4_ = fVar250 * auVar75._12_4_ * fVar174;
            auVar75 = vdpps_avx(auVar78,local_9a0._0_16_,0x7f);
            auVar82 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar167),auVar139);
            auVar81 = vdpps_avx(auVar73,auVar182,0x7f);
            auVar82 = vfmadd213ss_fma(ZEXT416((uint)(fVar173 + 1.0)),
                                      ZEXT416((uint)(fVar167 / fVar170)),auVar82);
            fVar169 = auVar75._0_4_ + auVar81._0_4_;
            auVar81 = vdpps_avx(local_9d0,local_9a0._0_16_,0x7f);
            auVar75 = vdpps_avx(auVar73,auVar78,0x7f);
            auVar77 = vmulss_avx512f(auVar77,auVar71);
            auVar79 = vaddss_avx512f(auVar76,ZEXT416((uint)(auVar77._0_4_ *
                                                           auVar71._0_4_ * auVar71._0_4_)));
            auVar76 = vdpps_avx(auVar73,local_9d0,0x7f);
            auVar78 = vfnmadd231ss_fma(auVar75,auVar80,ZEXT416((uint)fVar169));
            auVar76 = vfnmadd231ss_fma(auVar76,auVar80,auVar81);
            auVar75 = vpermilps_avx(local_800._0_16_,0xff);
            fVar172 = fVar172 - auVar75._0_4_;
            auVar77 = vshufps_avx(auVar74,auVar74,0xff);
            auVar75 = vfmsub213ss_fma(auVar78,auVar79,auVar77);
            auVar238._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
            auVar238._8_4_ = auVar75._8_4_ ^ 0x80000000;
            auVar238._12_4_ = auVar75._12_4_ ^ 0x80000000;
            auVar76 = ZEXT416((uint)(auVar76._0_4_ * auVar79._0_4_));
            auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar75._0_4_)),
                                      ZEXT416((uint)fVar169),auVar76);
            auVar75 = vinsertps_avx(auVar238,auVar76,0x1c);
            auVar224._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
            auVar224._8_4_ = auVar81._8_4_ ^ 0x80000000;
            auVar224._12_4_ = auVar81._12_4_ ^ 0x80000000;
            auVar76 = vinsertps_avx(ZEXT416((uint)fVar169),auVar224,0x10);
            auVar203._0_4_ = auVar78._0_4_;
            auVar203._4_4_ = auVar203._0_4_;
            auVar203._8_4_ = auVar203._0_4_;
            auVar203._12_4_ = auVar203._0_4_;
            auVar81 = vdivps_avx(auVar75,auVar203);
            auVar75 = vdivps_avx(auVar76,auVar203);
            auVar204._0_4_ = fVar171 * auVar81._0_4_ + fVar172 * auVar75._0_4_;
            auVar204._4_4_ = fVar171 * auVar81._4_4_ + fVar172 * auVar75._4_4_;
            auVar204._8_4_ = fVar171 * auVar81._8_4_ + fVar172 * auVar75._8_4_;
            auVar204._12_4_ = fVar171 * auVar81._12_4_ + fVar172 * auVar75._12_4_;
            auVar81 = vsubps_avx(local_740._0_16_,auVar204);
            auVar153 = ZEXT1664(auVar81);
            auVar25._8_4_ = 0x7fffffff;
            auVar25._0_8_ = 0x7fffffff7fffffff;
            auVar25._12_4_ = 0x7fffffff;
            auVar80 = vandps_avx512vl(auVar80,auVar25);
            if (auVar80._0_4_ < auVar82._0_4_) {
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ + auVar139._0_4_)),local_960,
                                        ZEXT416(0x36000000));
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx512vl(ZEXT416((uint)fVar172),auVar26);
              if (auVar75._0_4_ < auVar80._0_4_) {
                bVar64 = uVar60 < 5;
                fVar154 = auVar81._0_4_ + (float)local_970._0_4_;
                if (fVar154 < fVar16) {
LAB_01b6e849:
                  bVar54 = 0;
                  goto LAB_01b6e851;
                }
                fVar167 = *(float *)(ray + k * 4 + 0x200);
                if (fVar154 <= fVar167) {
                  auVar81 = vmovshdup_avx(auVar81);
                  bVar54 = 0;
                  if ((auVar81._0_4_ < 0.0) || (1.0 < auVar81._0_4_)) goto LAB_01b6e851;
                  auVar205._0_12_ = ZEXT812(0);
                  auVar205._12_4_ = 0;
                  auVar245._0_16_ = auVar205;
                  auVar252._4_60_ = auVar245._4_60_;
                  auVar252._0_4_ = fVar168;
                  auVar81 = vrsqrt14ss_avx512f(auVar205,auVar252._0_16_);
                  fVar168 = auVar81._0_4_;
                  auVar72 = vmulss_avx512f(auVar72,ZEXT416(0xbf000000));
                  pGVar3 = (context->scene->geometries).items[uVar2].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01b6e849;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar54 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01b6e851;
                  fVar168 = fVar168 * 1.5 + auVar72._0_4_ * fVar168 * fVar168 * fVar168;
                  auVar183._0_4_ = auVar73._0_4_ * fVar168;
                  auVar183._4_4_ = auVar73._4_4_ * fVar168;
                  auVar183._8_4_ = auVar73._8_4_ * fVar168;
                  auVar183._12_4_ = auVar73._12_4_ * fVar168;
                  auVar81 = vfmadd213ps_fma(auVar77,auVar183,auVar74);
                  auVar72 = vshufps_avx(auVar183,auVar183,0xc9);
                  auVar73 = vshufps_avx(auVar74,auVar74,0xc9);
                  auVar184._0_4_ = auVar183._0_4_ * auVar73._0_4_;
                  auVar184._4_4_ = auVar183._4_4_ * auVar73._4_4_;
                  auVar184._8_4_ = auVar183._8_4_ * auVar73._8_4_;
                  auVar184._12_4_ = auVar183._12_4_ * auVar73._12_4_;
                  auVar74 = vfmsub231ps_fma(auVar184,auVar74,auVar72);
                  auVar72 = vshufps_avx(auVar74,auVar74,0xc9);
                  auVar73 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar74 = vshufps_avx(auVar74,auVar74,0xd2);
                  auVar142._0_4_ = auVar81._0_4_ * auVar74._0_4_;
                  auVar142._4_4_ = auVar81._4_4_ * auVar74._4_4_;
                  auVar142._8_4_ = auVar81._8_4_ * auVar74._8_4_;
                  auVar142._12_4_ = auVar81._12_4_ * auVar74._12_4_;
                  auVar72 = vfmsub231ps_fma(auVar142,auVar72,auVar73);
                  auVar230 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar230,auVar153);
                  auVar153 = vpermps_avx512f(auVar230,ZEXT1664(auVar72));
                  auVar230 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar230,ZEXT1664(auVar72));
                  local_380 = vbroadcastss_avx512f(auVar72);
                  local_400[0] = (RTCHitN)auVar153[0];
                  local_400[1] = (RTCHitN)auVar153[1];
                  local_400[2] = (RTCHitN)auVar153[2];
                  local_400[3] = (RTCHitN)auVar153[3];
                  local_400[4] = (RTCHitN)auVar153[4];
                  local_400[5] = (RTCHitN)auVar153[5];
                  local_400[6] = (RTCHitN)auVar153[6];
                  local_400[7] = (RTCHitN)auVar153[7];
                  local_400[8] = (RTCHitN)auVar153[8];
                  local_400[9] = (RTCHitN)auVar153[9];
                  local_400[10] = (RTCHitN)auVar153[10];
                  local_400[0xb] = (RTCHitN)auVar153[0xb];
                  local_400[0xc] = (RTCHitN)auVar153[0xc];
                  local_400[0xd] = (RTCHitN)auVar153[0xd];
                  local_400[0xe] = (RTCHitN)auVar153[0xe];
                  local_400[0xf] = (RTCHitN)auVar153[0xf];
                  local_400[0x10] = (RTCHitN)auVar153[0x10];
                  local_400[0x11] = (RTCHitN)auVar153[0x11];
                  local_400[0x12] = (RTCHitN)auVar153[0x12];
                  local_400[0x13] = (RTCHitN)auVar153[0x13];
                  local_400[0x14] = (RTCHitN)auVar153[0x14];
                  local_400[0x15] = (RTCHitN)auVar153[0x15];
                  local_400[0x16] = (RTCHitN)auVar153[0x16];
                  local_400[0x17] = (RTCHitN)auVar153[0x17];
                  local_400[0x18] = (RTCHitN)auVar153[0x18];
                  local_400[0x19] = (RTCHitN)auVar153[0x19];
                  local_400[0x1a] = (RTCHitN)auVar153[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar153[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar153[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar153[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar153[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar153[0x1f];
                  local_400[0x20] = (RTCHitN)auVar153[0x20];
                  local_400[0x21] = (RTCHitN)auVar153[0x21];
                  local_400[0x22] = (RTCHitN)auVar153[0x22];
                  local_400[0x23] = (RTCHitN)auVar153[0x23];
                  local_400[0x24] = (RTCHitN)auVar153[0x24];
                  local_400[0x25] = (RTCHitN)auVar153[0x25];
                  local_400[0x26] = (RTCHitN)auVar153[0x26];
                  local_400[0x27] = (RTCHitN)auVar153[0x27];
                  local_400[0x28] = (RTCHitN)auVar153[0x28];
                  local_400[0x29] = (RTCHitN)auVar153[0x29];
                  local_400[0x2a] = (RTCHitN)auVar153[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar153[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar153[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar153[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar153[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar153[0x2f];
                  local_400[0x30] = (RTCHitN)auVar153[0x30];
                  local_400[0x31] = (RTCHitN)auVar153[0x31];
                  local_400[0x32] = (RTCHitN)auVar153[0x32];
                  local_400[0x33] = (RTCHitN)auVar153[0x33];
                  local_400[0x34] = (RTCHitN)auVar153[0x34];
                  local_400[0x35] = (RTCHitN)auVar153[0x35];
                  local_400[0x36] = (RTCHitN)auVar153[0x36];
                  local_400[0x37] = (RTCHitN)auVar153[0x37];
                  local_400[0x38] = (RTCHitN)auVar153[0x38];
                  local_400[0x39] = (RTCHitN)auVar153[0x39];
                  local_400[0x3a] = (RTCHitN)auVar153[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar153[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar153[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar153[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar153[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar153[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar153 = vmovdqa64_avx512f(local_4c0);
                  local_280 = vmovdqa64_avx512f(auVar153);
                  vpcmpeqd_avx2(auVar153._0_32_,auVar153._0_32_);
                  local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar154;
                  auVar153 = vmovdqa64_avx512f(local_500);
                  local_700 = vmovdqa64_avx512f(auVar153);
                  local_af0.valid = (int *)local_700;
                  local_af0.geometryUserPtr = pGVar3->userPtr;
                  local_af0.context = context->user;
                  local_af0.hit = local_400;
                  local_af0.N = 0x10;
                  local_af0.ray = (RTCRayN *)ray;
                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar254 = ZEXT1664(auVar71);
                    (*pGVar3->occlusionFilterN)(&local_af0);
                    auVar92 = vmovdqa64_avx512vl(auVar99);
                    auVar255 = ZEXT3264(auVar92);
                    auVar153 = vmovdqa64_avx512f(local_700);
                  }
                  uVar18 = vptestmd_avx512f(auVar153,auVar153);
                  if ((short)uVar18 != 0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar254 = ZEXT1664(auVar254._0_16_);
                      (*p_Var8)(&local_af0);
                      auVar92 = vmovdqa64_avx512vl(auVar99);
                      auVar255 = ZEXT3264(auVar92);
                      auVar153 = vmovdqa64_avx512f(local_700);
                    }
                    uVar67 = vptestmd_avx512f(auVar153,auVar153);
                    auVar153 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar9 = (bool)((byte)uVar67 & 1);
                    auVar256._0_4_ =
                         (uint)bVar9 * auVar153._0_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x200);
                    bVar9 = (bool)((byte)(uVar67 >> 1) & 1);
                    auVar256._4_4_ =
                         (uint)bVar9 * auVar153._4_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x204);
                    bVar9 = (bool)((byte)(uVar67 >> 2) & 1);
                    auVar256._8_4_ =
                         (uint)bVar9 * auVar153._8_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x208);
                    bVar9 = (bool)((byte)(uVar67 >> 3) & 1);
                    auVar256._12_4_ =
                         (uint)bVar9 * auVar153._12_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x20c);
                    bVar9 = (bool)((byte)(uVar67 >> 4) & 1);
                    auVar256._16_4_ =
                         (uint)bVar9 * auVar153._16_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x210);
                    bVar9 = (bool)((byte)(uVar67 >> 5) & 1);
                    auVar256._20_4_ =
                         (uint)bVar9 * auVar153._20_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x214);
                    bVar9 = (bool)((byte)(uVar67 >> 6) & 1);
                    auVar256._24_4_ =
                         (uint)bVar9 * auVar153._24_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x218);
                    bVar9 = (bool)((byte)(uVar67 >> 7) & 1);
                    auVar256._28_4_ =
                         (uint)bVar9 * auVar153._28_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x21c);
                    bVar9 = (bool)((byte)(uVar67 >> 8) & 1);
                    auVar256._32_4_ =
                         (uint)bVar9 * auVar153._32_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x220);
                    bVar9 = (bool)((byte)(uVar67 >> 9) & 1);
                    auVar256._36_4_ =
                         (uint)bVar9 * auVar153._36_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x224);
                    bVar9 = (bool)((byte)(uVar67 >> 10) & 1);
                    auVar256._40_4_ =
                         (uint)bVar9 * auVar153._40_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x228);
                    bVar9 = (bool)((byte)(uVar67 >> 0xb) & 1);
                    auVar256._44_4_ =
                         (uint)bVar9 * auVar153._44_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x22c);
                    bVar9 = (bool)((byte)(uVar67 >> 0xc) & 1);
                    auVar256._48_4_ =
                         (uint)bVar9 * auVar153._48_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x230);
                    bVar9 = (bool)((byte)(uVar67 >> 0xd) & 1);
                    auVar256._52_4_ =
                         (uint)bVar9 * auVar153._52_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x234);
                    bVar9 = (bool)((byte)(uVar67 >> 0xe) & 1);
                    auVar256._56_4_ =
                         (uint)bVar9 * auVar153._56_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x238);
                    bVar9 = SUB81(uVar67 >> 0xf,0);
                    auVar256._60_4_ =
                         (uint)bVar9 * auVar153._60_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x23c);
                    *(undefined1 (*) [64])(local_af0.ray + 0x200) = auVar256;
                    bVar54 = 1;
                    if ((short)uVar67 != 0) goto LAB_01b6e851;
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar167;
                }
                bVar54 = 0;
                goto LAB_01b6e851;
              }
            }
            uVar60 = uVar60 + 1;
          }
          bVar64 = false;
LAB_01b6e851:
          bVar55 = bVar55 | bVar64 & bVar54;
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar228._4_4_ = uVar155;
          auVar228._0_4_ = uVar155;
          auVar228._8_4_ = uVar155;
          auVar228._12_4_ = uVar155;
          auVar228._16_4_ = uVar155;
          auVar228._20_4_ = uVar155;
          auVar228._24_4_ = uVar155;
          auVar228._28_4_ = uVar155;
          auVar230 = ZEXT3264(auVar228);
          auVar48._4_4_ = fStack_67c;
          auVar48._0_4_ = local_680;
          auVar48._8_4_ = fStack_678;
          auVar48._12_4_ = fStack_674;
          auVar48._16_4_ = fStack_670;
          auVar48._20_4_ = fStack_66c;
          auVar48._24_4_ = fStack_668;
          auVar48._28_4_ = fStack_664;
          uVar18 = vcmpps_avx512vl(auVar228,auVar48,0xd);
        }
        auVar150._0_4_ = (float)local_760._0_4_ + (float)local_6a0._0_4_;
        auVar150._4_4_ = (float)local_760._4_4_ + (float)local_6a0._4_4_;
        auVar150._8_4_ = fStack_758 + fStack_698;
        auVar150._12_4_ = fStack_754 + fStack_694;
        auVar150._16_4_ = fStack_750 + fStack_690;
        auVar150._20_4_ = fStack_74c + fStack_68c;
        auVar150._24_4_ = fStack_748 + fStack_688;
        auVar150._28_4_ = fStack_744 + fStack_684;
        uVar155 = auVar230._0_4_;
        auVar165._4_4_ = uVar155;
        auVar165._0_4_ = uVar155;
        auVar165._8_4_ = uVar155;
        auVar165._12_4_ = uVar155;
        auVar165._16_4_ = uVar155;
        auVar165._20_4_ = uVar155;
        auVar165._24_4_ = uVar155;
        auVar165._28_4_ = uVar155;
        uVar18 = vcmpps_avx512vl(auVar150,auVar165,2);
        auVar151._8_4_ = 2;
        auVar151._0_8_ = 0x200000002;
        auVar151._12_4_ = 2;
        auVar151._16_4_ = 2;
        auVar151._20_4_ = 2;
        auVar151._24_4_ = 2;
        auVar151._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar92 = vpblendmd_avx512vl(auVar151,auVar35);
        local_6a0._0_4_ = (uint)(bVar53 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar53 & 1) * 2;
        bVar64 = (bool)(bVar53 >> 1 & 1);
        local_6a0._4_4_ = (uint)bVar64 * auVar92._4_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar53 >> 2 & 1);
        fStack_698 = (float)((uint)bVar64 * auVar92._8_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar53 >> 3 & 1);
        fStack_694 = (float)((uint)bVar64 * auVar92._12_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar53 >> 4 & 1);
        fStack_690 = (float)((uint)bVar64 * auVar92._16_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar53 >> 5 & 1);
        fStack_68c = (float)((uint)bVar64 * auVar92._20_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar53 >> 6 & 1);
        fStack_688 = (float)((uint)bVar64 * auVar92._24_4_ | (uint)!bVar64 * 2);
        fStack_684 = (float)((uint)(bVar53 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar53 >> 7) * 2);
        bVar52 = (byte)uVar19 & bVar52 & (byte)uVar18;
        uVar18 = vpcmpd_avx512vl(_local_6a0,local_640,2);
        local_780 = _local_620;
        local_680 = (float)local_760._0_4_ + (float)local_620._0_4_;
        fStack_67c = (float)local_760._4_4_ + (float)local_620._4_4_;
        fStack_678 = fStack_758 + fStack_618;
        fStack_674 = fStack_754 + fStack_614;
        fStack_670 = fStack_750 + fStack_610;
        fStack_66c = fStack_74c + fStack_60c;
        fStack_668 = fStack_748 + fStack_608;
        fStack_664 = fStack_744 + fStack_604;
        auVar245 = ZEXT3264(local_a00);
        auVar256 = ZEXT3264(local_a20);
        auVar252 = ZEXT3264(local_a40);
        auVar241 = ZEXT3264(local_a60);
        auVar153 = ZEXT3264(local_a80);
        auVar236 = ZEXT3264(local_aa0);
        auVar244 = ZEXT3264(local_ac0);
        for (bVar61 = (byte)uVar18 & bVar52; bVar61 != 0; bVar61 = ~bVar53 & bVar61 & (byte)uVar18)
        {
          auVar152._8_4_ = 0x7f800000;
          auVar152._0_8_ = 0x7f8000007f800000;
          auVar152._12_4_ = 0x7f800000;
          auVar152._16_4_ = 0x7f800000;
          auVar152._20_4_ = 0x7f800000;
          auVar152._24_4_ = 0x7f800000;
          auVar152._28_4_ = 0x7f800000;
          auVar92 = vblendmps_avx512vl(auVar152,local_780);
          auVar131._0_4_ =
               (uint)(bVar61 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
          bVar64 = (bool)(bVar61 >> 1 & 1);
          auVar131._4_4_ = (uint)bVar64 * auVar92._4_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar61 >> 2 & 1);
          auVar131._8_4_ = (uint)bVar64 * auVar92._8_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar61 >> 3 & 1);
          auVar131._12_4_ = (uint)bVar64 * auVar92._12_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar61 >> 4 & 1);
          auVar131._16_4_ = (uint)bVar64 * auVar92._16_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar61 >> 5 & 1);
          auVar131._20_4_ = (uint)bVar64 * auVar92._20_4_ | (uint)!bVar64 * 0x7f800000;
          auVar131._24_4_ =
               (uint)(bVar61 >> 6) * auVar92._24_4_ | (uint)!(bool)(bVar61 >> 6) * 0x7f800000;
          auVar131._28_4_ = 0x7f800000;
          auVar92 = vshufps_avx(auVar131,auVar131,0xb1);
          auVar92 = vminps_avx(auVar131,auVar92);
          auVar103 = vshufpd_avx(auVar92,auVar92,5);
          auVar92 = vminps_avx(auVar92,auVar103);
          auVar103 = vpermpd_avx2(auVar92,0x4e);
          auVar92 = vminps_avx(auVar92,auVar103);
          uVar18 = vcmpps_avx512vl(auVar131,auVar92,0);
          bVar59 = (byte)uVar18 & bVar61;
          bVar53 = bVar61;
          if (bVar59 != 0) {
            bVar53 = bVar59;
          }
          iVar21 = 0;
          for (uVar68 = (uint)bVar53; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
            iVar21 = iVar21 + 1;
          }
          bVar53 = '\x01' << ((byte)iVar21 & 0x1f);
          uVar68 = *(uint *)(local_540 + (uint)(iVar21 << 2));
          uVar132 = *(uint *)(local_600 + (uint)(iVar21 << 2));
          fVar154 = auVar70._0_4_;
          if ((float)local_9e0._0_4_ < 0.0) {
            auVar254 = ZEXT1664(auVar254._0_16_);
            fVar154 = sqrtf((float)local_9e0._0_4_);
            auVar92 = vmovdqa64_avx512vl(auVar99);
            auVar255 = ZEXT3264(auVar92);
            auVar244 = ZEXT3264(local_ac0);
            auVar236 = ZEXT3264(local_aa0);
            auVar153 = ZEXT3264(local_a80);
            auVar241 = ZEXT3264(local_a60);
            auVar252 = ZEXT3264(local_a40);
            auVar256 = ZEXT3264(local_a20);
            auVar245 = ZEXT3264(local_a00);
          }
          uVar67 = (ulong)bVar53;
          auVar73 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar72 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar74 = vminps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar81 = vminps_avx(auVar73,auVar74);
          auVar73 = vmaxps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar74 = vmaxps_avx(auVar72,auVar73);
          auVar206._8_4_ = 0x7fffffff;
          auVar206._0_8_ = 0x7fffffff7fffffff;
          auVar206._12_4_ = 0x7fffffff;
          auVar72 = vandps_avx(auVar81,auVar206);
          auVar73 = vandps_avx(auVar74,auVar206);
          auVar72 = vmaxps_avx(auVar72,auVar73);
          auVar73 = vmovshdup_avx(auVar72);
          auVar73 = vmaxss_avx(auVar73,auVar72);
          auVar72 = vshufpd_avx(auVar72,auVar72,1);
          auVar72 = vmaxss_avx(auVar72,auVar73);
          fVar167 = auVar72._0_4_ * 1.9073486e-06;
          local_960 = vshufps_avx(auVar74,auVar74,0xff);
          auVar72 = vinsertps_avx(ZEXT416(uVar132),ZEXT416(uVar68),0x10);
          auVar230 = ZEXT1664(auVar72);
          uVar60 = 0;
          while( true ) {
            bVar59 = (byte)uVar67;
            if (uVar60 == 5) break;
            uVar155 = auVar230._0_4_;
            auVar143._4_4_ = uVar155;
            auVar143._0_4_ = uVar155;
            auVar143._8_4_ = uVar155;
            auVar143._12_4_ = uVar155;
            auVar73 = vfmadd132ps_fma(auVar143,ZEXT816(0) << 0x40,local_9d0);
            auVar74 = auVar230._0_16_;
            auVar72 = vmovshdup_avx(auVar74);
            local_840._0_16_ = auVar72;
            fVar172 = 1.0 - auVar72._0_4_;
            auVar72 = vshufps_avx(auVar74,auVar74,0x55);
            fVar168 = auVar72._0_4_;
            auVar185._0_4_ = local_8e0._0_4_ * fVar168;
            fVar169 = auVar72._4_4_;
            auVar185._4_4_ = local_8e0._4_4_ * fVar169;
            fVar171 = auVar72._8_4_;
            auVar185._8_4_ = local_8e0._8_4_ * fVar171;
            fVar170 = auVar72._12_4_;
            auVar185._12_4_ = local_8e0._12_4_ * fVar170;
            _local_820 = ZEXT416((uint)fVar172);
            auVar207._4_4_ = fVar172;
            auVar207._0_4_ = fVar172;
            auVar207._8_4_ = fVar172;
            auVar207._12_4_ = fVar172;
            auVar72 = vfmadd231ps_fma(auVar185,auVar207,local_8a0._0_16_);
            auVar217._0_4_ = local_8c0._0_4_ * fVar168;
            auVar217._4_4_ = local_8c0._4_4_ * fVar169;
            auVar217._8_4_ = local_8c0._8_4_ * fVar171;
            auVar217._12_4_ = local_8c0._12_4_ * fVar170;
            auVar74 = vfmadd231ps_fma(auVar217,auVar207,local_8e0._0_16_);
            auVar225._0_4_ = fVar168 * (float)local_900._0_4_;
            auVar225._4_4_ = fVar169 * (float)local_900._4_4_;
            auVar225._8_4_ = fVar171 * fStack_8f8;
            auVar225._12_4_ = fVar170 * fStack_8f4;
            auVar81 = vfmadd231ps_fma(auVar225,auVar207,local_8c0._0_16_);
            auVar233._0_4_ = fVar168 * auVar74._0_4_;
            auVar233._4_4_ = fVar169 * auVar74._4_4_;
            auVar233._8_4_ = fVar171 * auVar74._8_4_;
            auVar233._12_4_ = fVar170 * auVar74._12_4_;
            auVar72 = vfmadd231ps_fma(auVar233,auVar207,auVar72);
            auVar186._0_4_ = fVar168 * auVar81._0_4_;
            auVar186._4_4_ = fVar169 * auVar81._4_4_;
            auVar186._8_4_ = fVar171 * auVar81._8_4_;
            auVar186._12_4_ = fVar170 * auVar81._12_4_;
            auVar74 = vfmadd231ps_fma(auVar186,auVar207,auVar74);
            auVar218._0_4_ = fVar168 * auVar74._0_4_;
            auVar218._4_4_ = fVar169 * auVar74._4_4_;
            auVar218._8_4_ = fVar171 * auVar74._8_4_;
            auVar218._12_4_ = fVar170 * auVar74._12_4_;
            auVar81 = vfmadd231ps_fma(auVar218,auVar72,auVar207);
            auVar72 = vsubps_avx(auVar74,auVar72);
            auVar27._8_4_ = 0x40400000;
            auVar27._0_8_ = 0x4040000040400000;
            auVar27._12_4_ = 0x40400000;
            auVar74 = vmulps_avx512vl(auVar72,auVar27);
            local_800._0_16_ = auVar81;
            auVar73 = vsubps_avx(auVar73,auVar81);
            auVar72 = vdpps_avx(auVar73,auVar73,0x7f);
            fVar168 = auVar72._0_4_;
            local_740 = auVar230;
            if (fVar168 < 0.0) {
              auVar241._0_4_ = sqrtf(fVar168);
              auVar241._4_60_ = extraout_var_00;
              auVar81 = auVar241._0_16_;
              uVar67 = extraout_RAX_02;
            }
            else {
              auVar81 = vsqrtss_avx(auVar72,auVar72);
            }
            local_860._0_16_ = vdpps_avx(auVar74,auVar74,0x7f);
            fVar169 = local_860._0_4_;
            auVar187._4_12_ = ZEXT812(0) << 0x20;
            auVar187._0_4_ = fVar169;
            local_9c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
            fVar171 = local_9c0._0_4_;
            local_880._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
            auVar28._8_4_ = 0x80000000;
            auVar28._0_8_ = 0x8000000080000000;
            auVar28._12_4_ = 0x80000000;
            auVar71 = vxorps_avx512vl(local_860._0_16_,auVar28);
            auVar80 = vfnmadd213ss_fma(local_880._0_16_,local_860._0_16_,ZEXT416(0x40000000));
            local_9a0._0_4_ = auVar80._0_4_;
            local_920._0_4_ = auVar81._0_4_;
            if (fVar169 < auVar71._0_4_) {
              fVar170 = sqrtf(fVar169);
              auVar81 = ZEXT416((uint)local_920._0_4_);
              uVar67 = extraout_RAX_03;
            }
            else {
              auVar80 = vsqrtss_avx(local_860._0_16_,local_860._0_16_);
              fVar170 = auVar80._0_4_;
            }
            fVar172 = local_9c0._0_4_;
            fVar169 = fVar171 * 1.5 + fVar169 * -0.5 * fVar172 * fVar172 * fVar172;
            auVar144._0_4_ = auVar74._0_4_ * fVar169;
            auVar144._4_4_ = auVar74._4_4_ * fVar169;
            auVar144._8_4_ = auVar74._8_4_ * fVar169;
            auVar144._12_4_ = auVar74._12_4_ * fVar169;
            local_9c0._0_16_ = vdpps_avx(auVar73,auVar144,0x7f);
            auVar71 = vaddss_avx512f(auVar81,ZEXT416(0x3f800000));
            auVar145._0_4_ = local_9c0._0_4_ * local_9c0._0_4_;
            auVar145._4_4_ = local_9c0._4_4_ * local_9c0._4_4_;
            auVar145._8_4_ = local_9c0._8_4_ * local_9c0._8_4_;
            auVar145._12_4_ = local_9c0._12_4_ * local_9c0._12_4_;
            auVar72 = vsubps_avx(auVar72,auVar145);
            fVar171 = auVar72._0_4_;
            auVar160._4_12_ = ZEXT812(0) << 0x20;
            auVar160._0_4_ = fVar171;
            auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar160);
            auVar75 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
            auVar76 = vmulss_avx512f(auVar72,ZEXT416(0xbf000000));
            uVar66 = fVar171 == 0.0;
            uVar65 = fVar171 < 0.0;
            if ((bool)uVar65) {
              local_950 = fVar169;
              fStack_94c = fVar169;
              fStack_948 = fVar169;
              fStack_944 = fVar169;
              local_940 = auVar80;
              fVar171 = sqrtf(fVar171);
              auVar76 = ZEXT416(auVar76._0_4_);
              auVar75 = ZEXT416(auVar75._0_4_);
              auVar81 = ZEXT416((uint)local_920._0_4_);
              auVar71 = ZEXT416(auVar71._0_4_);
              uVar67 = extraout_RAX_04;
              auVar80 = local_940;
              fVar169 = local_950;
              fVar172 = fStack_94c;
              fVar173 = fStack_948;
              fVar249 = fStack_944;
            }
            else {
              auVar72 = vsqrtss_avx(auVar72,auVar72);
              fVar171 = auVar72._0_4_;
              fVar172 = fVar169;
              fVar173 = fVar169;
              fVar249 = fVar169;
            }
            auVar254 = ZEXT1664(auVar73);
            auVar245 = ZEXT3264(local_a00);
            auVar256 = ZEXT3264(local_a20);
            auVar252 = ZEXT3264(local_a40);
            auVar153 = ZEXT3264(local_a80);
            auVar92 = vmovdqa64_avx512vl(auVar99);
            auVar255 = ZEXT3264(auVar92);
            auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_820,local_840._0_16_);
            auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_840._0_16_,_local_820);
            fVar175 = auVar72._0_4_ * 6.0;
            fVar250 = local_840._0_4_ * 6.0;
            auVar208._0_4_ = fVar250 * (float)local_900._0_4_;
            auVar208._4_4_ = fVar250 * (float)local_900._4_4_;
            auVar208._8_4_ = fVar250 * fStack_8f8;
            auVar208._12_4_ = fVar250 * fStack_8f4;
            auVar188._4_4_ = fVar175;
            auVar188._0_4_ = fVar175;
            auVar188._8_4_ = fVar175;
            auVar188._12_4_ = fVar175;
            auVar72 = vfmadd132ps_fma(auVar188,auVar208,local_8c0._0_16_);
            fVar175 = auVar77._0_4_ * 6.0;
            auVar161._4_4_ = fVar175;
            auVar161._0_4_ = fVar175;
            auVar161._8_4_ = fVar175;
            auVar161._12_4_ = fVar175;
            auVar72 = vfmadd132ps_fma(auVar161,auVar72,local_8e0._0_16_);
            fVar175 = local_820._0_4_ * 6.0;
            auVar189._4_4_ = fVar175;
            auVar189._0_4_ = fVar175;
            auVar189._8_4_ = fVar175;
            auVar189._12_4_ = fVar175;
            auVar72 = vfmadd132ps_fma(auVar189,auVar72,local_8a0._0_16_);
            auVar162._0_4_ = auVar72._0_4_ * (float)local_860._0_4_;
            auVar162._4_4_ = auVar72._4_4_ * (float)local_860._0_4_;
            auVar162._8_4_ = auVar72._8_4_ * (float)local_860._0_4_;
            auVar162._12_4_ = auVar72._12_4_ * (float)local_860._0_4_;
            auVar72 = vdpps_avx(auVar74,auVar72,0x7f);
            fVar175 = auVar72._0_4_;
            auVar190._0_4_ = auVar74._0_4_ * fVar175;
            auVar190._4_4_ = auVar74._4_4_ * fVar175;
            auVar190._8_4_ = auVar74._8_4_ * fVar175;
            auVar190._12_4_ = auVar74._12_4_ * fVar175;
            auVar72 = vsubps_avx(auVar162,auVar190);
            fVar175 = (float)local_9a0._0_4_ * (float)local_880._0_4_;
            auVar77 = vmaxss_avx(ZEXT416((uint)fVar167),
                                 ZEXT416((uint)(local_740._0_4_ * fVar154 * 1.9073486e-06)));
            auVar29._8_4_ = 0x80000000;
            auVar29._0_8_ = 0x8000000080000000;
            auVar29._12_4_ = 0x80000000;
            auVar82 = vxorps_avx512vl(auVar74,auVar29);
            auVar191._0_4_ = fVar169 * auVar72._0_4_ * fVar175;
            auVar191._4_4_ = fVar172 * auVar72._4_4_ * fVar175;
            auVar191._8_4_ = fVar173 * auVar72._8_4_ * fVar175;
            auVar191._12_4_ = fVar249 * auVar72._12_4_ * fVar175;
            auVar72 = vdpps_avx(auVar82,auVar144,0x7f);
            auVar139 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar167),auVar77);
            auVar81 = vdpps_avx(auVar73,auVar191,0x7f);
            vfmadd213ss_avx512f(auVar71,ZEXT416((uint)(fVar167 / fVar170)),auVar139);
            fVar169 = auVar72._0_4_ + auVar81._0_4_;
            auVar72 = vdpps_avx(local_9d0,auVar144,0x7f);
            auVar81 = vdpps_avx(auVar73,auVar82,0x7f);
            auVar71 = vmulss_avx512f(auVar76,auVar80);
            auVar80 = vmulss_avx512f(auVar80,auVar80);
            auVar75 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar71._0_4_ * auVar80._0_4_)));
            auVar80 = vdpps_avx(auVar73,local_9d0,0x7f);
            auVar76 = vfnmadd231ss_avx512f(auVar81,local_9c0._0_16_,ZEXT416((uint)fVar169));
            auVar80 = vfnmadd231ss_avx512f(auVar80,local_9c0._0_16_,auVar72);
            auVar81 = vpermilps_avx(local_800._0_16_,0xff);
            fVar171 = fVar171 - auVar81._0_4_;
            auVar71 = vshufps_avx(auVar74,auVar74,0xff);
            auVar81 = vfmsub213ss_fma(auVar76,auVar75,auVar71);
            auVar239._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
            auVar239._8_4_ = auVar81._8_4_ ^ 0x80000000;
            auVar239._12_4_ = auVar81._12_4_ ^ 0x80000000;
            auVar80 = ZEXT416((uint)(auVar80._0_4_ * auVar75._0_4_));
            auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar81._0_4_)),
                                      ZEXT416((uint)fVar169),auVar80);
            auVar81 = vinsertps_avx(auVar239,auVar80,0x1c);
            auVar226._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
            auVar226._8_4_ = auVar72._8_4_ ^ 0x80000000;
            auVar226._12_4_ = auVar72._12_4_ ^ 0x80000000;
            auVar80 = vinsertps_avx(ZEXT416((uint)fVar169),auVar226,0x10);
            auVar209._0_4_ = auVar75._0_4_;
            auVar209._4_4_ = auVar209._0_4_;
            auVar209._8_4_ = auVar209._0_4_;
            auVar209._12_4_ = auVar209._0_4_;
            auVar72 = vdivps_avx(auVar81,auVar209);
            auVar81 = vdivps_avx(auVar80,auVar209);
            auVar80 = vbroadcastss_avx512vl(local_9c0._0_16_);
            auVar210._0_4_ = auVar80._0_4_ * auVar72._0_4_ + fVar171 * auVar81._0_4_;
            auVar210._4_4_ = auVar80._4_4_ * auVar72._4_4_ + fVar171 * auVar81._4_4_;
            auVar210._8_4_ = auVar80._8_4_ * auVar72._8_4_ + fVar171 * auVar81._8_4_;
            auVar210._12_4_ = auVar80._12_4_ * auVar72._12_4_ + fVar171 * auVar81._12_4_;
            auVar72 = vsubps_avx(local_740._0_16_,auVar210);
            auVar230 = ZEXT1664(auVar72);
            auVar30._8_4_ = 0x7fffffff;
            auVar30._0_8_ = 0x7fffffff7fffffff;
            auVar30._12_4_ = 0x7fffffff;
            auVar81 = vandps_avx512vl(local_9c0._0_16_,auVar30);
            auVar81 = vucomiss_avx512f(auVar81);
            if (!(bool)uVar65 && !(bool)uVar66) {
              auVar81 = vaddss_avx512f(auVar77,auVar81);
              auVar81 = vfmadd231ss_fma(auVar81,local_960,ZEXT416(0x36000000));
              auVar31._8_4_ = 0x7fffffff;
              auVar31._0_8_ = 0x7fffffff7fffffff;
              auVar31._12_4_ = 0x7fffffff;
              auVar80 = vandps_avx512vl(ZEXT416((uint)fVar171),auVar31);
              if (auVar80._0_4_ < auVar81._0_4_) {
                bVar64 = uVar60 < 5;
                fVar154 = auVar72._0_4_ + (float)local_970._0_4_;
                auVar241 = ZEXT3264(local_a60);
                auVar236 = ZEXT3264(local_aa0);
                auVar244 = ZEXT3264(local_ac0);
                if (fVar154 < fVar16) {
LAB_01b6f433:
                  bVar59 = 0;
                  goto LAB_01b6f43b;
                }
                fVar167 = *(float *)(ray + k * 4 + 0x200);
                if (fVar154 <= fVar167) {
                  auVar72 = vmovshdup_avx(auVar72);
                  bVar59 = 0;
                  if ((auVar72._0_4_ < 0.0) || (1.0 < auVar72._0_4_)) goto LAB_01b6f43b;
                  auVar211._0_12_ = ZEXT812(0);
                  auVar211._12_4_ = 0;
                  auVar192._4_8_ = auVar211._4_8_;
                  auVar192._0_4_ = fVar168;
                  auVar192._12_4_ = 0;
                  auVar72 = vrsqrt14ss_avx512f(auVar211,auVar192);
                  fVar169 = auVar72._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar2].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01b6f433;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar59 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01b6f43b;
                  fVar168 = fVar169 * 1.5 + fVar168 * -0.5 * fVar169 * fVar169 * fVar169;
                  auVar193._0_4_ = auVar73._0_4_ * fVar168;
                  auVar193._4_4_ = auVar73._4_4_ * fVar168;
                  auVar193._8_4_ = auVar73._8_4_ * fVar168;
                  auVar193._12_4_ = auVar73._12_4_ * fVar168;
                  auVar80 = vfmadd213ps_fma(auVar71,auVar193,auVar74);
                  auVar72 = vshufps_avx(auVar193,auVar193,0xc9);
                  auVar81 = vshufps_avx(auVar74,auVar74,0xc9);
                  auVar194._0_4_ = auVar193._0_4_ * auVar81._0_4_;
                  auVar194._4_4_ = auVar193._4_4_ * auVar81._4_4_;
                  auVar194._8_4_ = auVar193._8_4_ * auVar81._8_4_;
                  auVar194._12_4_ = auVar193._12_4_ * auVar81._12_4_;
                  auVar81 = vfmsub231ps_fma(auVar194,auVar74,auVar72);
                  auVar72 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar74 = vshufps_avx(auVar80,auVar80,0xc9);
                  auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                  auVar146._0_4_ = auVar80._0_4_ * auVar81._0_4_;
                  auVar146._4_4_ = auVar80._4_4_ * auVar81._4_4_;
                  auVar146._8_4_ = auVar80._8_4_ * auVar81._8_4_;
                  auVar146._12_4_ = auVar80._12_4_ * auVar81._12_4_;
                  auVar72 = vfmsub231ps_fma(auVar146,auVar72,auVar74);
                  auVar258 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar258,auVar230);
                  auVar230 = vpermps_avx512f(auVar258,ZEXT1664(auVar72));
                  auVar258 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar258,ZEXT1664(auVar72));
                  local_380 = vbroadcastss_avx512f(auVar72);
                  local_400[0] = (RTCHitN)auVar230[0];
                  local_400[1] = (RTCHitN)auVar230[1];
                  local_400[2] = (RTCHitN)auVar230[2];
                  local_400[3] = (RTCHitN)auVar230[3];
                  local_400[4] = (RTCHitN)auVar230[4];
                  local_400[5] = (RTCHitN)auVar230[5];
                  local_400[6] = (RTCHitN)auVar230[6];
                  local_400[7] = (RTCHitN)auVar230[7];
                  local_400[8] = (RTCHitN)auVar230[8];
                  local_400[9] = (RTCHitN)auVar230[9];
                  local_400[10] = (RTCHitN)auVar230[10];
                  local_400[0xb] = (RTCHitN)auVar230[0xb];
                  local_400[0xc] = (RTCHitN)auVar230[0xc];
                  local_400[0xd] = (RTCHitN)auVar230[0xd];
                  local_400[0xe] = (RTCHitN)auVar230[0xe];
                  local_400[0xf] = (RTCHitN)auVar230[0xf];
                  local_400[0x10] = (RTCHitN)auVar230[0x10];
                  local_400[0x11] = (RTCHitN)auVar230[0x11];
                  local_400[0x12] = (RTCHitN)auVar230[0x12];
                  local_400[0x13] = (RTCHitN)auVar230[0x13];
                  local_400[0x14] = (RTCHitN)auVar230[0x14];
                  local_400[0x15] = (RTCHitN)auVar230[0x15];
                  local_400[0x16] = (RTCHitN)auVar230[0x16];
                  local_400[0x17] = (RTCHitN)auVar230[0x17];
                  local_400[0x18] = (RTCHitN)auVar230[0x18];
                  local_400[0x19] = (RTCHitN)auVar230[0x19];
                  local_400[0x1a] = (RTCHitN)auVar230[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar230[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar230[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar230[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar230[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar230[0x1f];
                  local_400[0x20] = (RTCHitN)auVar230[0x20];
                  local_400[0x21] = (RTCHitN)auVar230[0x21];
                  local_400[0x22] = (RTCHitN)auVar230[0x22];
                  local_400[0x23] = (RTCHitN)auVar230[0x23];
                  local_400[0x24] = (RTCHitN)auVar230[0x24];
                  local_400[0x25] = (RTCHitN)auVar230[0x25];
                  local_400[0x26] = (RTCHitN)auVar230[0x26];
                  local_400[0x27] = (RTCHitN)auVar230[0x27];
                  local_400[0x28] = (RTCHitN)auVar230[0x28];
                  local_400[0x29] = (RTCHitN)auVar230[0x29];
                  local_400[0x2a] = (RTCHitN)auVar230[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar230[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar230[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar230[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar230[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar230[0x2f];
                  local_400[0x30] = (RTCHitN)auVar230[0x30];
                  local_400[0x31] = (RTCHitN)auVar230[0x31];
                  local_400[0x32] = (RTCHitN)auVar230[0x32];
                  local_400[0x33] = (RTCHitN)auVar230[0x33];
                  local_400[0x34] = (RTCHitN)auVar230[0x34];
                  local_400[0x35] = (RTCHitN)auVar230[0x35];
                  local_400[0x36] = (RTCHitN)auVar230[0x36];
                  local_400[0x37] = (RTCHitN)auVar230[0x37];
                  local_400[0x38] = (RTCHitN)auVar230[0x38];
                  local_400[0x39] = (RTCHitN)auVar230[0x39];
                  local_400[0x3a] = (RTCHitN)auVar230[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar230[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar230[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar230[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar230[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar230[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar230 = vmovdqa64_avx512f(local_4c0);
                  local_280 = vmovdqa64_avx512f(auVar230);
                  vpcmpeqd_avx2(auVar230._0_32_,auVar230._0_32_);
                  local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar154;
                  auVar230 = vmovdqa64_avx512f(local_500);
                  local_700 = vmovdqa64_avx512f(auVar230);
                  local_af0.valid = (int *)local_700;
                  local_af0.geometryUserPtr = pGVar3->userPtr;
                  local_af0.context = context->user;
                  local_af0.hit = local_400;
                  local_af0.N = 0x10;
                  local_af0.ray = (RTCRayN *)ray;
                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar254 = ZEXT1664(auVar73);
                    (*pGVar3->occlusionFilterN)(&local_af0);
                    auVar92 = vmovdqa64_avx512vl(auVar99);
                    auVar255 = ZEXT3264(auVar92);
                    auVar244 = ZEXT3264(local_ac0);
                    auVar236 = ZEXT3264(local_aa0);
                    auVar153 = ZEXT3264(local_a80);
                    auVar241 = ZEXT3264(local_a60);
                    auVar252 = ZEXT3264(local_a40);
                    auVar256 = ZEXT3264(local_a20);
                    auVar245 = ZEXT3264(local_a00);
                    auVar230 = vmovdqa64_avx512f(local_700);
                  }
                  uVar18 = vptestmd_avx512f(auVar230,auVar230);
                  if ((short)uVar18 != 0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar254 = ZEXT1664(auVar254._0_16_);
                      (*p_Var8)(&local_af0);
                      auVar92 = vmovdqa64_avx512vl(auVar99);
                      auVar255 = ZEXT3264(auVar92);
                      auVar244 = ZEXT3264(local_ac0);
                      auVar236 = ZEXT3264(local_aa0);
                      auVar153 = ZEXT3264(local_a80);
                      auVar241 = ZEXT3264(local_a60);
                      auVar252 = ZEXT3264(local_a40);
                      auVar256 = ZEXT3264(local_a20);
                      auVar245 = ZEXT3264(local_a00);
                      auVar230 = vmovdqa64_avx512f(local_700);
                    }
                    uVar67 = vptestmd_avx512f(auVar230,auVar230);
                    auVar230 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar9 = (bool)((byte)uVar67 & 1);
                    auVar258._0_4_ =
                         (uint)bVar9 * auVar230._0_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x200);
                    bVar9 = (bool)((byte)(uVar67 >> 1) & 1);
                    auVar258._4_4_ =
                         (uint)bVar9 * auVar230._4_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x204);
                    bVar9 = (bool)((byte)(uVar67 >> 2) & 1);
                    auVar258._8_4_ =
                         (uint)bVar9 * auVar230._8_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x208);
                    bVar9 = (bool)((byte)(uVar67 >> 3) & 1);
                    auVar258._12_4_ =
                         (uint)bVar9 * auVar230._12_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x20c);
                    bVar9 = (bool)((byte)(uVar67 >> 4) & 1);
                    auVar258._16_4_ =
                         (uint)bVar9 * auVar230._16_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x210);
                    bVar9 = (bool)((byte)(uVar67 >> 5) & 1);
                    auVar258._20_4_ =
                         (uint)bVar9 * auVar230._20_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x214);
                    bVar9 = (bool)((byte)(uVar67 >> 6) & 1);
                    auVar258._24_4_ =
                         (uint)bVar9 * auVar230._24_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x218);
                    bVar9 = (bool)((byte)(uVar67 >> 7) & 1);
                    auVar258._28_4_ =
                         (uint)bVar9 * auVar230._28_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x21c);
                    bVar9 = (bool)((byte)(uVar67 >> 8) & 1);
                    auVar258._32_4_ =
                         (uint)bVar9 * auVar230._32_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x220);
                    bVar9 = (bool)((byte)(uVar67 >> 9) & 1);
                    auVar258._36_4_ =
                         (uint)bVar9 * auVar230._36_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x224);
                    bVar9 = (bool)((byte)(uVar67 >> 10) & 1);
                    auVar258._40_4_ =
                         (uint)bVar9 * auVar230._40_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x228);
                    bVar9 = (bool)((byte)(uVar67 >> 0xb) & 1);
                    auVar258._44_4_ =
                         (uint)bVar9 * auVar230._44_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x22c);
                    bVar9 = (bool)((byte)(uVar67 >> 0xc) & 1);
                    auVar258._48_4_ =
                         (uint)bVar9 * auVar230._48_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x230);
                    bVar9 = (bool)((byte)(uVar67 >> 0xd) & 1);
                    auVar258._52_4_ =
                         (uint)bVar9 * auVar230._52_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x234);
                    bVar9 = (bool)((byte)(uVar67 >> 0xe) & 1);
                    auVar258._56_4_ =
                         (uint)bVar9 * auVar230._56_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x238);
                    bVar9 = SUB81(uVar67 >> 0xf,0);
                    auVar258._60_4_ =
                         (uint)bVar9 * auVar230._60_4_ |
                         (uint)!bVar9 * *(int *)(local_af0.ray + 0x23c);
                    *(undefined1 (*) [64])(local_af0.ray + 0x200) = auVar258;
                    bVar59 = 1;
                    if ((short)uVar67 != 0) goto LAB_01b6f43b;
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar167;
                }
                bVar59 = 0;
                goto LAB_01b6f43b;
              }
            }
            uVar60 = uVar60 + 1;
            auVar241 = ZEXT3264(local_a60);
            auVar236 = ZEXT3264(local_aa0);
            auVar244 = ZEXT3264(local_ac0);
          }
          bVar64 = false;
LAB_01b6f43b:
          bVar55 = bVar55 | bVar64 & bVar59;
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar229._4_4_ = uVar155;
          auVar229._0_4_ = uVar155;
          auVar229._8_4_ = uVar155;
          auVar229._12_4_ = uVar155;
          auVar229._16_4_ = uVar155;
          auVar229._20_4_ = uVar155;
          auVar229._24_4_ = uVar155;
          auVar229._28_4_ = uVar155;
          auVar230 = ZEXT3264(auVar229);
          auVar49._4_4_ = fStack_67c;
          auVar49._0_4_ = local_680;
          auVar49._8_4_ = fStack_678;
          auVar49._12_4_ = fStack_674;
          auVar49._16_4_ = fStack_670;
          auVar49._20_4_ = fStack_66c;
          auVar49._24_4_ = fStack_668;
          auVar49._28_4_ = fStack_664;
          uVar18 = vcmpps_avx512vl(auVar229,auVar49,0xd);
        }
        uVar20 = vpcmpd_avx512vl(local_640,local_5e0,1);
        uVar19 = vpcmpd_avx512vl(local_640,_local_6a0,1);
        auVar166._0_4_ = (float)local_760._0_4_ + (float)local_440._0_4_;
        auVar166._4_4_ = (float)local_760._4_4_ + (float)local_440._4_4_;
        auVar166._8_4_ = fStack_758 + fStack_438;
        auVar166._12_4_ = fStack_754 + fStack_434;
        auVar166._16_4_ = fStack_750 + fStack_430;
        auVar166._20_4_ = fStack_74c + fStack_42c;
        auVar166._24_4_ = fStack_748 + fStack_428;
        auVar166._28_4_ = fStack_744 + fStack_424;
        uVar155 = auVar230._0_4_;
        auVar198._4_4_ = uVar155;
        auVar198._0_4_ = uVar155;
        auVar198._8_4_ = uVar155;
        auVar198._12_4_ = uVar155;
        auVar198._16_4_ = uVar155;
        auVar198._20_4_ = uVar155;
        auVar198._24_4_ = uVar155;
        auVar198._28_4_ = uVar155;
        uVar18 = vcmpps_avx512vl(auVar166,auVar198,2);
        bVar58 = bVar58 & (byte)uVar20 & (byte)uVar18;
        auVar213._0_4_ = (float)local_760._0_4_ + (float)local_620._0_4_;
        auVar213._4_4_ = (float)local_760._4_4_ + (float)local_620._4_4_;
        auVar213._8_4_ = fStack_758 + fStack_618;
        auVar213._12_4_ = fStack_754 + fStack_614;
        auVar213._16_4_ = fStack_750 + fStack_610;
        auVar213._20_4_ = fStack_74c + fStack_60c;
        auVar213._24_4_ = fStack_748 + fStack_608;
        auVar213._28_4_ = fStack_744 + fStack_604;
        uVar18 = vcmpps_avx512vl(auVar213,auVar198,2);
        bVar52 = bVar52 & (byte)uVar19 & (byte)uVar18 | bVar58;
        if (bVar52 != 0) {
          abStack_1a0[uVar56 * 0x60] = bVar52;
          bVar64 = (bool)(bVar58 >> 1 & 1);
          bVar9 = (bool)(bVar58 >> 2 & 1);
          bVar10 = (bool)(bVar58 >> 3 & 1);
          bVar11 = (bool)(bVar58 >> 4 & 1);
          bVar12 = (bool)(bVar58 >> 5 & 1);
          auStack_180[uVar56 * 0x18] =
               (uint)(bVar58 & 1) * local_440._0_4_ | (uint)!(bool)(bVar58 & 1) * local_620._0_4_;
          auStack_180[uVar56 * 0x18 + 1] =
               (uint)bVar64 * local_440._4_4_ | (uint)!bVar64 * local_620._4_4_;
          auStack_180[uVar56 * 0x18 + 2] =
               (uint)bVar9 * (int)fStack_438 | (uint)!bVar9 * (int)fStack_618;
          auStack_180[uVar56 * 0x18 + 3] =
               (uint)bVar10 * (int)fStack_434 | (uint)!bVar10 * (int)fStack_614;
          auStack_180[uVar56 * 0x18 + 4] =
               (uint)bVar11 * (int)fStack_430 | (uint)!bVar11 * (int)fStack_610;
          auStack_180[uVar56 * 0x18 + 5] =
               (uint)bVar12 * (int)fStack_42c | (uint)!bVar12 * (int)fStack_60c;
          auStack_180[uVar56 * 0x18 + 6] =
               (uint)(bVar58 >> 6) * (int)fStack_428 | (uint)!(bool)(bVar58 >> 6) * (int)fStack_608;
          (&fStack_164)[uVar56 * 0x18] = fStack_604;
          uVar67 = vmovlps_avx(local_650);
          (&uStack_160)[uVar56 * 0xc] = uVar67;
          aiStack_158[uVar56 * 0x18] = local_cf4 + 1;
          uVar56 = (ulong)((int)uVar56 + 1);
        }
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar258 = ZEXT3264(auVar92);
        auVar230 = ZEXT3264(_DAT_01f7b040);
      }
    }
    do {
      uVar68 = (uint)uVar56;
      uVar56 = (ulong)(uVar68 - 1);
      if (uVar68 == 0) {
        if (bVar55 != 0) goto LAB_01b6fa15;
        uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar37._4_4_ = uVar155;
        auVar37._0_4_ = uVar155;
        auVar37._8_4_ = uVar155;
        auVar37._12_4_ = uVar155;
        auVar37._16_4_ = uVar155;
        auVar37._20_4_ = uVar155;
        auVar37._24_4_ = uVar155;
        auVar37._28_4_ = uVar155;
        uVar18 = vcmpps_avx512vl(local_5c0,auVar37,2);
        uVar63 = (ulong)((uint)uVar18 & (uint)uVar63 - 1 & (uint)uVar63);
        goto LAB_01b6d0e8;
      }
      auVar92 = *(undefined1 (*) [32])(auStack_180 + uVar56 * 0x18);
      auVar163._0_4_ = auVar92._0_4_ + (float)local_760._0_4_;
      auVar163._4_4_ = auVar92._4_4_ + (float)local_760._4_4_;
      auVar163._8_4_ = auVar92._8_4_ + fStack_758;
      auVar163._12_4_ = auVar92._12_4_ + fStack_754;
      auVar163._16_4_ = auVar92._16_4_ + fStack_750;
      auVar163._20_4_ = auVar92._20_4_ + fStack_74c;
      auVar163._24_4_ = auVar92._24_4_ + fStack_748;
      auVar163._28_4_ = auVar92._28_4_ + fStack_744;
      uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar36._4_4_ = uVar155;
      auVar36._0_4_ = uVar155;
      auVar36._8_4_ = uVar155;
      auVar36._12_4_ = uVar155;
      auVar36._16_4_ = uVar155;
      auVar36._20_4_ = uVar155;
      auVar36._24_4_ = uVar155;
      auVar36._28_4_ = uVar155;
      uVar18 = vcmpps_avx512vl(auVar163,auVar36,2);
      uVar132 = (uint)uVar18 & (uint)abStack_1a0[uVar56 * 0x60];
    } while (uVar132 == 0);
    uVar67 = (&uStack_160)[uVar56 * 0xc];
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar67;
    auVar197._8_4_ = 0x7f800000;
    auVar197._0_8_ = 0x7f8000007f800000;
    auVar197._12_4_ = 0x7f800000;
    auVar197._16_4_ = 0x7f800000;
    auVar197._20_4_ = 0x7f800000;
    auVar197._24_4_ = 0x7f800000;
    auVar197._28_4_ = 0x7f800000;
    auVar103 = vblendmps_avx512vl(auVar197,auVar92);
    bVar52 = (byte)uVar132;
    auVar129._0_4_ =
         (uint)(bVar52 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar52 & 1) * (int)auVar92._0_4_;
    bVar64 = (bool)((byte)(uVar132 >> 1) & 1);
    auVar129._4_4_ = (uint)bVar64 * auVar103._4_4_ | (uint)!bVar64 * (int)auVar92._4_4_;
    bVar64 = (bool)((byte)(uVar132 >> 2) & 1);
    auVar129._8_4_ = (uint)bVar64 * auVar103._8_4_ | (uint)!bVar64 * (int)auVar92._8_4_;
    bVar64 = (bool)((byte)(uVar132 >> 3) & 1);
    auVar129._12_4_ = (uint)bVar64 * auVar103._12_4_ | (uint)!bVar64 * (int)auVar92._12_4_;
    bVar64 = (bool)((byte)(uVar132 >> 4) & 1);
    auVar129._16_4_ = (uint)bVar64 * auVar103._16_4_ | (uint)!bVar64 * (int)auVar92._16_4_;
    bVar64 = (bool)((byte)(uVar132 >> 5) & 1);
    auVar129._20_4_ = (uint)bVar64 * auVar103._20_4_ | (uint)!bVar64 * (int)auVar92._20_4_;
    bVar64 = (bool)((byte)(uVar132 >> 6) & 1);
    auVar129._24_4_ = (uint)bVar64 * auVar103._24_4_ | (uint)!bVar64 * (int)auVar92._24_4_;
    auVar129._28_4_ =
         (uVar132 >> 7) * auVar103._28_4_ | (uint)!SUB41(uVar132 >> 7,0) * (int)auVar92._28_4_;
    auVar92 = vshufps_avx(auVar129,auVar129,0xb1);
    auVar92 = vminps_avx(auVar129,auVar92);
    auVar103 = vshufpd_avx(auVar92,auVar92,5);
    auVar92 = vminps_avx(auVar92,auVar103);
    auVar103 = vpermpd_avx2(auVar92,0x4e);
    auVar92 = vminps_avx(auVar92,auVar103);
    uVar18 = vcmpps_avx512vl(auVar129,auVar92,0);
    bVar61 = (byte)uVar18 & bVar52;
    if (bVar61 != 0) {
      uVar132 = (uint)bVar61;
    }
    uVar133 = 0;
    for (; (uVar132 & 1) == 0; uVar132 = uVar132 >> 1 | 0x80000000) {
      uVar133 = uVar133 + 1;
    }
    local_cf4 = aiStack_158[uVar56 * 0x18];
    bVar52 = ~('\x01' << ((byte)uVar133 & 0x1f)) & bVar52;
    abStack_1a0[uVar56 * 0x60] = bVar52;
    if (bVar52 == 0) {
      uVar68 = uVar68 - 1;
    }
    uVar155 = (undefined4)uVar67;
    auVar147._4_4_ = uVar155;
    auVar147._0_4_ = uVar155;
    auVar147._8_4_ = uVar155;
    auVar147._12_4_ = uVar155;
    auVar147._16_4_ = uVar155;
    auVar147._20_4_ = uVar155;
    auVar147._24_4_ = uVar155;
    auVar147._28_4_ = uVar155;
    auVar72 = vmovshdup_avx(auVar156);
    auVar72 = vsubps_avx(auVar72,auVar156);
    auVar164._0_4_ = auVar72._0_4_;
    auVar164._4_4_ = auVar164._0_4_;
    auVar164._8_4_ = auVar164._0_4_;
    auVar164._12_4_ = auVar164._0_4_;
    auVar164._16_4_ = auVar164._0_4_;
    auVar164._20_4_ = auVar164._0_4_;
    auVar164._24_4_ = auVar164._0_4_;
    auVar164._28_4_ = auVar164._0_4_;
    auVar72 = vfmadd132ps_fma(auVar164,auVar147,auVar230._0_32_);
    auVar92 = ZEXT1632(auVar72);
    local_400[0] = (RTCHitN)auVar92[0];
    local_400[1] = (RTCHitN)auVar92[1];
    local_400[2] = (RTCHitN)auVar92[2];
    local_400[3] = (RTCHitN)auVar92[3];
    local_400[4] = (RTCHitN)auVar92[4];
    local_400[5] = (RTCHitN)auVar92[5];
    local_400[6] = (RTCHitN)auVar92[6];
    local_400[7] = (RTCHitN)auVar92[7];
    local_400[8] = (RTCHitN)auVar92[8];
    local_400[9] = (RTCHitN)auVar92[9];
    local_400[10] = (RTCHitN)auVar92[10];
    local_400[0xb] = (RTCHitN)auVar92[0xb];
    local_400[0xc] = (RTCHitN)auVar92[0xc];
    local_400[0xd] = (RTCHitN)auVar92[0xd];
    local_400[0xe] = (RTCHitN)auVar92[0xe];
    local_400[0xf] = (RTCHitN)auVar92[0xf];
    local_400[0x10] = (RTCHitN)auVar92[0x10];
    local_400[0x11] = (RTCHitN)auVar92[0x11];
    local_400[0x12] = (RTCHitN)auVar92[0x12];
    local_400[0x13] = (RTCHitN)auVar92[0x13];
    local_400[0x14] = (RTCHitN)auVar92[0x14];
    local_400[0x15] = (RTCHitN)auVar92[0x15];
    local_400[0x16] = (RTCHitN)auVar92[0x16];
    local_400[0x17] = (RTCHitN)auVar92[0x17];
    local_400[0x18] = (RTCHitN)auVar92[0x18];
    local_400[0x19] = (RTCHitN)auVar92[0x19];
    local_400[0x1a] = (RTCHitN)auVar92[0x1a];
    local_400[0x1b] = (RTCHitN)auVar92[0x1b];
    local_400[0x1c] = (RTCHitN)auVar92[0x1c];
    local_400[0x1d] = (RTCHitN)auVar92[0x1d];
    local_400[0x1e] = (RTCHitN)auVar92[0x1e];
    local_400[0x1f] = (RTCHitN)auVar92[0x1f];
    local_650._8_8_ = 0;
    local_650._0_8_ = *(ulong *)(local_400 + (ulong)uVar133 * 4);
    uVar56 = (ulong)uVar68;
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }